

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx512::CurveNvIntersectorK<8,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  int iVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  bool bVar66;
  byte bVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  Geometry *geometry;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  long lVar71;
  long lVar72;
  byte bVar73;
  ulong uVar74;
  float fVar75;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar124;
  float fVar126;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar81 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar82 [16];
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar130;
  float fVar131;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar132;
  undefined4 uVar133;
  undefined4 uVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar140;
  float fVar141;
  undefined1 auVar139 [32];
  undefined8 uVar142;
  undefined1 auVar143 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  float fVar146;
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 in_ZMM4 [64];
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_5e0 [16];
  ulong local_5c8;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  Geometry *local_5a0;
  ulong local_598;
  RTCFilterFunctionNArguments local_590;
  undefined1 local_560 [32];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  long local_470;
  ulong local_468;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined4 local_360;
  undefined4 uStack_35c;
  undefined4 uStack_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  RTCHitN local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined4 local_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined1 local_2d0 [16];
  uint local_2c0;
  uint uStack_2bc;
  uint uStack_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  uint uStack_2a8;
  uint uStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  int local_21c;
  undefined1 local_210 [16];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar68 = (ulong)(byte)prim[1];
  fVar147 = *(float *)(prim + uVar68 * 0x19 + 0x12);
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar81 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar144 = vsubps_avx(auVar78,*(undefined1 (*) [16])(prim + uVar68 * 0x19 + 6));
  fVar146 = fVar147 * auVar144._0_4_;
  fVar132 = fVar147 * auVar81._0_4_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar68 * 4 + 6);
  auVar93 = vpmovsxbd_avx2(auVar78);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar68 * 5 + 6);
  auVar89 = vpmovsxbd_avx2(auVar80);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar68 * 6 + 6);
  auVar90 = vpmovsxbd_avx2(auVar77);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar68 * 0xb + 6);
  auVar91 = vpmovsxbd_avx2(auVar76);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar68 * 0xc + 6);
  auVar92 = vpmovsxbd_avx2(auVar6);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar68 * 0xd + 6);
  auVar94 = vpmovsxbd_avx2(auVar7);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar68 * 0x12 + 6);
  auVar101 = vpmovsxbd_avx2(auVar8);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar68 * 0x13 + 6);
  auVar100 = vpmovsxbd_avx2(auVar9);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar68 * 0x14 + 6);
  auVar96 = vpmovsxbd_avx2(auVar79);
  auVar95 = vcvtdq2ps_avx(auVar96);
  auVar171._4_4_ = fVar132;
  auVar171._0_4_ = fVar132;
  auVar171._8_4_ = fVar132;
  auVar171._12_4_ = fVar132;
  auVar171._16_4_ = fVar132;
  auVar171._20_4_ = fVar132;
  auVar171._24_4_ = fVar132;
  auVar171._28_4_ = fVar132;
  auVar174._8_4_ = 1;
  auVar174._0_8_ = 0x100000001;
  auVar174._12_4_ = 1;
  auVar174._16_4_ = 1;
  auVar174._20_4_ = 1;
  auVar174._24_4_ = 1;
  auVar174._28_4_ = 1;
  auVar85 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar88 = ZEXT1632(CONCAT412(fVar147 * auVar81._12_4_,
                               CONCAT48(fVar147 * auVar81._8_4_,
                                        CONCAT44(fVar147 * auVar81._4_4_,fVar132))));
  auVar87 = vpermps_avx2(auVar174,auVar88);
  auVar86 = vpermps_avx512vl(auVar85,auVar88);
  fVar132 = auVar86._0_4_;
  auVar184._0_4_ = fVar132 * auVar90._0_4_;
  fVar140 = auVar86._4_4_;
  auVar184._4_4_ = fVar140 * auVar90._4_4_;
  fVar141 = auVar86._8_4_;
  auVar184._8_4_ = fVar141 * auVar90._8_4_;
  fVar161 = auVar86._12_4_;
  auVar184._12_4_ = fVar161 * auVar90._12_4_;
  fVar160 = auVar86._16_4_;
  auVar184._16_4_ = fVar160 * auVar90._16_4_;
  fVar162 = auVar86._20_4_;
  auVar184._20_4_ = fVar162 * auVar90._20_4_;
  fVar75 = auVar86._24_4_;
  auVar184._28_36_ = in_ZMM4._28_36_;
  auVar184._24_4_ = fVar75 * auVar90._24_4_;
  auVar88._4_4_ = auVar94._4_4_ * fVar140;
  auVar88._0_4_ = auVar94._0_4_ * fVar132;
  auVar88._8_4_ = auVar94._8_4_ * fVar141;
  auVar88._12_4_ = auVar94._12_4_ * fVar161;
  auVar88._16_4_ = auVar94._16_4_ * fVar160;
  auVar88._20_4_ = auVar94._20_4_ * fVar162;
  auVar88._24_4_ = auVar94._24_4_ * fVar75;
  auVar88._28_4_ = auVar96._28_4_;
  auVar96._4_4_ = auVar95._4_4_ * fVar140;
  auVar96._0_4_ = auVar95._0_4_ * fVar132;
  auVar96._8_4_ = auVar95._8_4_ * fVar141;
  auVar96._12_4_ = auVar95._12_4_ * fVar161;
  auVar96._16_4_ = auVar95._16_4_ * fVar160;
  auVar96._20_4_ = auVar95._20_4_ * fVar162;
  auVar96._24_4_ = auVar95._24_4_ * fVar75;
  auVar96._28_4_ = auVar86._28_4_;
  auVar78 = vfmadd231ps_fma(auVar184._0_32_,auVar87,auVar89);
  auVar80 = vfmadd231ps_fma(auVar88,auVar87,auVar92);
  auVar77 = vfmadd231ps_fma(auVar96,auVar100,auVar87);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar171,auVar93);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar171,auVar91);
  auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar101,auVar171);
  auVar172._4_4_ = fVar146;
  auVar172._0_4_ = fVar146;
  auVar172._8_4_ = fVar146;
  auVar172._12_4_ = fVar146;
  auVar172._16_4_ = fVar146;
  auVar172._20_4_ = fVar146;
  auVar172._24_4_ = fVar146;
  auVar172._28_4_ = fVar146;
  auVar87 = ZEXT1632(CONCAT412(fVar147 * auVar144._12_4_,
                               CONCAT48(fVar147 * auVar144._8_4_,
                                        CONCAT44(fVar147 * auVar144._4_4_,fVar146))));
  auVar96 = vpermps_avx2(auVar174,auVar87);
  auVar87 = vpermps_avx512vl(auVar85,auVar87);
  auVar88 = vmulps_avx512vl(auVar87,auVar90);
  auVar98._0_4_ = auVar87._0_4_ * auVar94._0_4_;
  auVar98._4_4_ = auVar87._4_4_ * auVar94._4_4_;
  auVar98._8_4_ = auVar87._8_4_ * auVar94._8_4_;
  auVar98._12_4_ = auVar87._12_4_ * auVar94._12_4_;
  auVar98._16_4_ = auVar87._16_4_ * auVar94._16_4_;
  auVar98._20_4_ = auVar87._20_4_ * auVar94._20_4_;
  auVar98._24_4_ = auVar87._24_4_ * auVar94._24_4_;
  auVar98._28_4_ = 0;
  auVar94._4_4_ = auVar87._4_4_ * auVar95._4_4_;
  auVar94._0_4_ = auVar87._0_4_ * auVar95._0_4_;
  auVar94._8_4_ = auVar87._8_4_ * auVar95._8_4_;
  auVar94._12_4_ = auVar87._12_4_ * auVar95._12_4_;
  auVar94._16_4_ = auVar87._16_4_ * auVar95._16_4_;
  auVar94._20_4_ = auVar87._20_4_ * auVar95._20_4_;
  auVar94._24_4_ = auVar87._24_4_ * auVar95._24_4_;
  auVar94._28_4_ = auVar90._28_4_;
  auVar89 = vfmadd231ps_avx512vl(auVar88,auVar96,auVar89);
  auVar76 = vfmadd231ps_fma(auVar98,auVar96,auVar92);
  auVar6 = vfmadd231ps_fma(auVar94,auVar96,auVar100);
  auVar89 = vfmadd231ps_avx512vl(auVar89,auVar172,auVar93);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar172,auVar91);
  auVar163._8_4_ = 0x7fffffff;
  auVar163._0_8_ = 0x7fffffff7fffffff;
  auVar163._12_4_ = 0x7fffffff;
  auVar163._16_4_ = 0x7fffffff;
  auVar163._20_4_ = 0x7fffffff;
  auVar163._24_4_ = 0x7fffffff;
  auVar163._28_4_ = 0x7fffffff;
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar172,auVar101);
  auVar93 = vandps_avx(ZEXT1632(auVar78),auVar163);
  auVar113._8_4_ = 0x219392ef;
  auVar113._0_8_ = 0x219392ef219392ef;
  auVar113._12_4_ = 0x219392ef;
  auVar113._16_4_ = 0x219392ef;
  auVar113._20_4_ = 0x219392ef;
  auVar113._24_4_ = 0x219392ef;
  auVar113._28_4_ = 0x219392ef;
  uVar74 = vcmpps_avx512vl(auVar93,auVar113,1);
  bVar66 = (bool)((byte)uVar74 & 1);
  auVar87._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar78._0_4_;
  bVar66 = (bool)((byte)(uVar74 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar78._4_4_;
  bVar66 = (bool)((byte)(uVar74 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar78._8_4_;
  bVar66 = (bool)((byte)(uVar74 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar78._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar74 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar80),auVar163);
  uVar74 = vcmpps_avx512vl(auVar93,auVar113,1);
  bVar66 = (bool)((byte)uVar74 & 1);
  auVar85._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar80._0_4_;
  bVar66 = (bool)((byte)(uVar74 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar80._4_4_;
  bVar66 = (bool)((byte)(uVar74 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar80._8_4_;
  bVar66 = (bool)((byte)(uVar74 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar80._12_4_;
  auVar85._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * 0x219392ef;
  auVar85._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * 0x219392ef;
  auVar85._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * 0x219392ef;
  auVar85._28_4_ = (uint)(byte)(uVar74 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar77),auVar163);
  uVar74 = vcmpps_avx512vl(auVar93,auVar113,1);
  bVar66 = (bool)((byte)uVar74 & 1);
  auVar93._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar77._0_4_;
  bVar66 = (bool)((byte)(uVar74 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar77._4_4_;
  bVar66 = (bool)((byte)(uVar74 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar77._8_4_;
  bVar66 = (bool)((byte)(uVar74 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar77._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar74 >> 7) * 0x219392ef;
  auVar90 = vrcp14ps_avx512vl(auVar87);
  auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar92 = vfnmadd213ps_avx512vl(auVar87,auVar90,auVar91);
  auVar78 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar85);
  auVar92 = vfnmadd213ps_avx512vl(auVar85,auVar90,auVar91);
  auVar80 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar93);
  auVar93 = vfnmadd213ps_avx512vl(auVar93,auVar90,auVar91);
  auVar77 = vfmadd132ps_fma(auVar93,auVar90,auVar90);
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 7 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx512vl(auVar93,auVar89);
  auVar101._4_4_ = auVar78._4_4_ * auVar93._4_4_;
  auVar101._0_4_ = auVar78._0_4_ * auVar93._0_4_;
  auVar101._8_4_ = auVar78._8_4_ * auVar93._8_4_;
  auVar101._12_4_ = auVar78._12_4_ * auVar93._12_4_;
  auVar101._16_4_ = auVar93._16_4_ * 0.0;
  auVar101._20_4_ = auVar93._20_4_ * 0.0;
  auVar101._24_4_ = auVar93._24_4_ * 0.0;
  auVar101._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 9 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx512vl(auVar93,auVar89);
  auVar99._0_4_ = auVar78._0_4_ * auVar93._0_4_;
  auVar99._4_4_ = auVar78._4_4_ * auVar93._4_4_;
  auVar99._8_4_ = auVar78._8_4_ * auVar93._8_4_;
  auVar99._12_4_ = auVar78._12_4_ * auVar93._12_4_;
  auVar99._16_4_ = auVar93._16_4_ * 0.0;
  auVar99._20_4_ = auVar93._20_4_ * 0.0;
  auVar99._24_4_ = auVar93._24_4_ * 0.0;
  auVar99._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 0xe + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar76));
  auVar100._4_4_ = auVar80._4_4_ * auVar93._4_4_;
  auVar100._0_4_ = auVar80._0_4_ * auVar93._0_4_;
  auVar100._8_4_ = auVar80._8_4_ * auVar93._8_4_;
  auVar100._12_4_ = auVar80._12_4_ * auVar93._12_4_;
  auVar100._16_4_ = auVar93._16_4_ * 0.0;
  auVar100._20_4_ = auVar93._20_4_ * 0.0;
  auVar100._24_4_ = auVar93._24_4_ * 0.0;
  auVar100._28_4_ = auVar93._28_4_;
  auVar94 = vpbroadcastd_avx512vl();
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar76));
  auVar97._0_4_ = auVar80._0_4_ * auVar93._0_4_;
  auVar97._4_4_ = auVar80._4_4_ * auVar93._4_4_;
  auVar97._8_4_ = auVar80._8_4_ * auVar93._8_4_;
  auVar97._12_4_ = auVar80._12_4_ * auVar93._12_4_;
  auVar97._16_4_ = auVar93._16_4_ * 0.0;
  auVar97._20_4_ = auVar93._20_4_ * 0.0;
  auVar97._24_4_ = auVar93._24_4_ * 0.0;
  auVar97._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 0x15 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar6));
  auVar95._4_4_ = auVar93._4_4_ * auVar77._4_4_;
  auVar95._0_4_ = auVar93._0_4_ * auVar77._0_4_;
  auVar95._8_4_ = auVar93._8_4_ * auVar77._8_4_;
  auVar95._12_4_ = auVar93._12_4_ * auVar77._12_4_;
  auVar95._16_4_ = auVar93._16_4_ * 0.0;
  auVar95._20_4_ = auVar93._20_4_ * 0.0;
  auVar95._24_4_ = auVar93._24_4_ * 0.0;
  auVar95._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 0x17 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar6));
  auVar86._0_4_ = auVar77._0_4_ * auVar93._0_4_;
  auVar86._4_4_ = auVar77._4_4_ * auVar93._4_4_;
  auVar86._8_4_ = auVar77._8_4_ * auVar93._8_4_;
  auVar86._12_4_ = auVar77._12_4_ * auVar93._12_4_;
  auVar86._16_4_ = auVar93._16_4_ * 0.0;
  auVar86._20_4_ = auVar93._20_4_ * 0.0;
  auVar86._24_4_ = auVar93._24_4_ * 0.0;
  auVar86._28_4_ = 0;
  auVar93 = vpminsd_avx2(auVar101,auVar99);
  auVar89 = vpminsd_avx2(auVar100,auVar97);
  auVar93 = vmaxps_avx(auVar93,auVar89);
  auVar89 = vpminsd_avx2(auVar95,auVar86);
  uVar133 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar90._4_4_ = uVar133;
  auVar90._0_4_ = uVar133;
  auVar90._8_4_ = uVar133;
  auVar90._12_4_ = uVar133;
  auVar90._16_4_ = uVar133;
  auVar90._20_4_ = uVar133;
  auVar90._24_4_ = uVar133;
  auVar90._28_4_ = uVar133;
  auVar89 = vmaxps_avx512vl(auVar89,auVar90);
  auVar93 = vmaxps_avx(auVar93,auVar89);
  auVar89._8_4_ = 0x3f7ffffa;
  auVar89._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar89._12_4_ = 0x3f7ffffa;
  auVar89._16_4_ = 0x3f7ffffa;
  auVar89._20_4_ = 0x3f7ffffa;
  auVar89._24_4_ = 0x3f7ffffa;
  auVar89._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar93,auVar89);
  auVar93 = vpmaxsd_avx2(auVar101,auVar99);
  auVar89 = vpmaxsd_avx2(auVar100,auVar97);
  auVar93 = vminps_avx(auVar93,auVar89);
  auVar89 = vpmaxsd_avx2(auVar95,auVar86);
  uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar91._4_4_ = uVar133;
  auVar91._0_4_ = uVar133;
  auVar91._8_4_ = uVar133;
  auVar91._12_4_ = uVar133;
  auVar91._16_4_ = uVar133;
  auVar91._20_4_ = uVar133;
  auVar91._24_4_ = uVar133;
  auVar91._28_4_ = uVar133;
  auVar89 = vminps_avx512vl(auVar89,auVar91);
  auVar93 = vminps_avx(auVar93,auVar89);
  auVar92._8_4_ = 0x3f800003;
  auVar92._0_8_ = 0x3f8000033f800003;
  auVar92._12_4_ = 0x3f800003;
  auVar92._16_4_ = 0x3f800003;
  auVar92._20_4_ = 0x3f800003;
  auVar92._24_4_ = 0x3f800003;
  auVar92._28_4_ = 0x3f800003;
  auVar93 = vmulps_avx512vl(auVar93,auVar92);
  uVar142 = vcmpps_avx512vl(local_80,auVar93,2);
  uVar18 = vpcmpgtd_avx512vl(auVar94,_DAT_01fb4ba0);
  local_468 = (ulong)(byte)((byte)uVar142 & (byte)uVar18);
  local_390 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  while (local_468 != 0) {
    iVar19 = 0;
    for (uVar74 = local_468; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
      iVar19 = iVar19 + 1;
    }
    uVar70 = local_468 - 1 & local_468;
    uVar74 = (ulong)(uint)(iVar19 << 6);
    local_5c8 = (ulong)*(uint *)(prim + 2);
    pGVar10 = (context->scene->geometries).items[local_5c8].ptr;
    local_5c0 = *(undefined1 (*) [16])(prim + uVar74 + uVar68 * 0x19 + 0x16);
    if (uVar70 != 0) {
      uVar69 = uVar70 - 1 & uVar70;
      for (uVar20 = uVar70; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
      }
      if (uVar69 != 0) {
        for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
        }
      }
    }
    local_510 = *(undefined1 (*) [16])(prim + uVar74 + uVar68 * 0x19 + 0x26);
    local_520 = *(undefined1 (*) [16])(prim + uVar74 + uVar68 * 0x19 + 0x36);
    _local_370 = *(undefined1 (*) [16])(prim + uVar74 + uVar68 * 0x19 + 0x46);
    iVar19 = (int)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar77 = vsubps_avx(local_5c0,auVar78);
    uVar133 = auVar77._0_4_;
    auVar81._4_4_ = uVar133;
    auVar81._0_4_ = uVar133;
    auVar81._8_4_ = uVar133;
    auVar81._12_4_ = uVar133;
    auVar80 = vshufps_avx(auVar77,auVar77,0x55);
    auVar77 = vshufps_avx(auVar77,auVar77,0xaa);
    aVar4 = pre->ray_space[k].vx.field_0;
    aVar5 = pre->ray_space[k].vy.field_0;
    fVar147 = pre->ray_space[k].vz.field_0.m128[0];
    fVar132 = pre->ray_space[k].vz.field_0.m128[1];
    fVar140 = pre->ray_space[k].vz.field_0.m128[2];
    fVar141 = pre->ray_space[k].vz.field_0.m128[3];
    auVar82._0_4_ = fVar147 * auVar77._0_4_;
    auVar82._4_4_ = fVar132 * auVar77._4_4_;
    auVar82._8_4_ = fVar140 * auVar77._8_4_;
    auVar82._12_4_ = fVar141 * auVar77._12_4_;
    auVar80 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar5,auVar80);
    auVar6 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar4,auVar81);
    auVar80 = vshufps_avx(local_5c0,local_5c0,0xff);
    auVar76 = vsubps_avx(local_510,auVar78);
    uVar133 = auVar76._0_4_;
    auVar148._4_4_ = uVar133;
    auVar148._0_4_ = uVar133;
    auVar148._8_4_ = uVar133;
    auVar148._12_4_ = uVar133;
    auVar77 = vshufps_avx(auVar76,auVar76,0x55);
    auVar76 = vshufps_avx(auVar76,auVar76,0xaa);
    auVar166._0_4_ = fVar147 * auVar76._0_4_;
    auVar166._4_4_ = fVar132 * auVar76._4_4_;
    auVar166._8_4_ = fVar140 * auVar76._8_4_;
    auVar166._12_4_ = fVar141 * auVar76._12_4_;
    auVar77 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar5,auVar77);
    auVar7 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar4,auVar148);
    auVar76 = vsubps_avx512vl(local_520,auVar78);
    uVar133 = auVar76._0_4_;
    auVar149._4_4_ = uVar133;
    auVar149._0_4_ = uVar133;
    auVar149._8_4_ = uVar133;
    auVar149._12_4_ = uVar133;
    auVar77 = vshufps_avx(auVar76,auVar76,0x55);
    auVar76 = vshufps_avx(auVar76,auVar76,0xaa);
    auVar168._0_4_ = fVar147 * auVar76._0_4_;
    auVar168._4_4_ = fVar132 * auVar76._4_4_;
    auVar168._8_4_ = fVar140 * auVar76._8_4_;
    auVar168._12_4_ = fVar141 * auVar76._12_4_;
    auVar77 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar5,auVar77);
    auVar76 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar4,auVar149);
    auVar77 = vsubps_avx512vl(_local_370,auVar78);
    uVar133 = auVar77._0_4_;
    auVar144._4_4_ = uVar133;
    auVar144._0_4_ = uVar133;
    auVar144._8_4_ = uVar133;
    auVar144._12_4_ = uVar133;
    auVar78 = vshufps_avx(auVar77,auVar77,0x55);
    auVar77 = vshufps_avx(auVar77,auVar77,0xaa);
    auVar169._0_4_ = fVar147 * auVar77._0_4_;
    auVar169._4_4_ = fVar132 * auVar77._4_4_;
    auVar169._8_4_ = fVar140 * auVar77._8_4_;
    auVar169._12_4_ = fVar141 * auVar77._12_4_;
    auVar78 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar5,auVar78);
    auVar77 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar4,auVar144);
    local_470 = (long)iVar19;
    lVar72 = local_470 * 0x44;
    auVar93 = *(undefined1 (*) [32])(bspline_basis0 + lVar72);
    local_3e0 = vbroadcastss_avx512vl(auVar6);
    auVar89 = *(undefined1 (*) [32])(bspline_basis0 + lVar72 + 0x484);
    auVar139._8_4_ = 1;
    auVar139._0_8_ = 0x100000001;
    auVar139._12_4_ = 1;
    auVar139._16_4_ = 1;
    auVar139._20_4_ = 1;
    auVar139._24_4_ = 1;
    auVar139._28_4_ = 1;
    local_400 = vpermps_avx2(auVar139,ZEXT1632(auVar6));
    local_420 = vbroadcastss_avx512vl(auVar7);
    local_440 = vpermps_avx2(auVar139,ZEXT1632(auVar7));
    auVar90 = *(undefined1 (*) [32])(bspline_basis0 + lVar72 + 0x908);
    local_560 = vbroadcastss_avx512vl(auVar76);
    local_500 = vpermps_avx512vl(auVar139,ZEXT1632(auVar76));
    auVar91 = *(undefined1 (*) [32])(bspline_basis0 + lVar72 + 0xd8c);
    local_4c0 = vbroadcastss_avx512vl(auVar77);
    auVar184 = ZEXT3264(local_4c0);
    local_4e0 = vpermps_avx512vl(auVar139,ZEXT1632(auVar77));
    auVar185 = ZEXT3264(local_4e0);
    auVar92 = vmulps_avx512vl(local_4c0,auVar91);
    auVar94 = vmulps_avx512vl(local_4e0,auVar91);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar90,local_560);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,local_500);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar89,local_420);
    auVar78 = vfmadd231ps_fma(auVar94,auVar89,local_440);
    auVar95 = vfmadd231ps_avx512vl(auVar92,auVar93,local_3e0);
    auVar92 = *(undefined1 (*) [32])(bspline_basis1 + lVar72);
    auVar94 = *(undefined1 (*) [32])(bspline_basis1 + lVar72 + 0x484);
    auVar101 = *(undefined1 (*) [32])(bspline_basis1 + lVar72 + 0x908);
    auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),auVar93,local_400);
    auVar100 = *(undefined1 (*) [32])(bspline_basis1 + lVar72 + 0xd8c);
    auVar87 = vmulps_avx512vl(local_4c0,auVar100);
    auVar88 = vmulps_avx512vl(local_4e0,auVar100);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar101,local_560);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar101,local_500);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar94,local_420);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar94,local_440);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar92,local_3e0);
    auVar8 = vfmadd231ps_fma(auVar88,auVar92,local_400);
    auVar88 = vsubps_avx512vl(auVar87,auVar95);
    auVar85 = vsubps_avx512vl(ZEXT1632(auVar8),auVar96);
    auVar86 = vmulps_avx512vl(auVar96,auVar88);
    auVar97 = vmulps_avx512vl(auVar95,auVar85);
    auVar86 = vsubps_avx512vl(auVar86,auVar97);
    auVar78 = vshufps_avx(local_510,local_510,0xff);
    uVar142 = auVar80._0_8_;
    local_a0._8_8_ = uVar142;
    local_a0._0_8_ = uVar142;
    local_a0._16_8_ = uVar142;
    local_a0._24_8_ = uVar142;
    local_c0 = vbroadcastsd_avx512vl(auVar78);
    auVar78 = vshufps_avx512vl(local_520,local_520,0xff);
    local_e0 = vbroadcastsd_avx512vl(auVar78);
    auVar78 = vshufps_avx512vl(_local_370,_local_370,0xff);
    uVar142 = auVar78._0_8_;
    register0x000012c8 = uVar142;
    local_100 = uVar142;
    register0x000012d0 = uVar142;
    register0x000012d8 = uVar142;
    auVar97 = vmulps_avx512vl(_local_100,auVar91);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar90,local_e0);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar89,local_c0);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,local_a0);
    auVar98 = vmulps_avx512vl(_local_100,auVar100);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar101,local_e0);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_c0);
    auVar9 = vfmadd231ps_fma(auVar98,auVar92,local_a0);
    auVar98 = vmulps_avx512vl(auVar85,auVar85);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar88,auVar88);
    auVar99 = vmaxps_avx512vl(auVar97,ZEXT1632(auVar9));
    auVar99 = vmulps_avx512vl(auVar99,auVar99);
    auVar98 = vmulps_avx512vl(auVar99,auVar98);
    auVar86 = vmulps_avx512vl(auVar86,auVar86);
    uVar142 = vcmpps_avx512vl(auVar86,auVar98,2);
    auVar78 = vblendps_avx(auVar6,local_5c0,8);
    auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar80 = vandps_avx512vl(auVar78,auVar79);
    auVar78 = vblendps_avx(auVar7,local_510,8);
    auVar78 = vandps_avx512vl(auVar78,auVar79);
    auVar80 = vmaxps_avx(auVar80,auVar78);
    auVar78 = vblendps_avx(auVar76,local_520,8);
    auVar81 = vandps_avx512vl(auVar78,auVar79);
    auVar78 = vblendps_avx(auVar77,_local_370,8);
    auVar78 = vandps_avx512vl(auVar78,auVar79);
    auVar78 = vmaxps_avx(auVar81,auVar78);
    auVar78 = vmaxps_avx(auVar80,auVar78);
    auVar80 = vmovshdup_avx(auVar78);
    auVar80 = vmaxss_avx(auVar80,auVar78);
    auVar78 = vshufpd_avx(auVar78,auVar78,1);
    local_530 = vcvtsi2ss_avx512f(local_520,iVar19);
    auVar78 = vmaxss_avx(auVar78,auVar80);
    fVar147 = local_530._0_4_;
    auVar170._4_4_ = fVar147;
    auVar170._0_4_ = fVar147;
    auVar170._8_4_ = fVar147;
    auVar170._12_4_ = fVar147;
    auVar170._16_4_ = fVar147;
    auVar170._20_4_ = fVar147;
    auVar170._24_4_ = fVar147;
    auVar170._28_4_ = fVar147;
    uVar18 = vcmpps_avx512vl(auVar170,_DAT_01f7b060,0xe);
    bVar73 = (byte)uVar142 & (byte)uVar18;
    local_460 = auVar78._0_4_ * 4.7683716e-07;
    auVar145._8_4_ = 2;
    auVar145._0_8_ = 0x200000002;
    auVar145._12_4_ = 2;
    auVar145._16_4_ = 2;
    auVar145._20_4_ = 2;
    auVar145._24_4_ = 2;
    auVar145._28_4_ = 2;
    local_120 = vpermps_avx512vl(auVar145,ZEXT1632(auVar6));
    local_140 = vpermps_avx512vl(auVar145,ZEXT1632(auVar7));
    local_160 = vpermps_avx512vl(auVar145,ZEXT1632(auVar76));
    local_4a0 = vpermps_avx2(auVar145,ZEXT1632(auVar77));
    uVar133 = *(undefined4 *)(ray + k * 4 + 0x30);
    local_380 = vpbroadcastd_avx512vl();
    auVar78 = ZEXT416((uint)local_460);
    if (bVar73 == 0) {
      bVar66 = false;
      auVar78 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
      auVar179 = ZEXT1664(auVar78);
      auVar180 = ZEXT3264(local_3e0);
      auVar181 = ZEXT3264(local_400);
      auVar182 = ZEXT3264(local_420);
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar186 = ZEXT3264(auVar93);
      auVar178 = ZEXT3264(local_440);
      auVar177 = ZEXT3264(local_560);
      auVar183 = ZEXT3264(local_500);
    }
    else {
      auVar100 = vmulps_avx512vl(local_4a0,auVar100);
      auVar101 = vfmadd213ps_avx512vl(auVar101,local_160,auVar100);
      auVar94 = vfmadd213ps_avx512vl(auVar94,local_140,auVar101);
      auVar94 = vfmadd213ps_avx512vl(auVar92,local_120,auVar94);
      auVar91 = vmulps_avx512vl(local_4a0,auVar91);
      auVar90 = vfmadd213ps_avx512vl(auVar90,local_160,auVar91);
      auVar101 = vfmadd213ps_avx512vl(auVar89,local_140,auVar90);
      auVar89 = *(undefined1 (*) [32])(bspline_basis0 + lVar72 + 0x1210);
      auVar90 = *(undefined1 (*) [32])(bspline_basis0 + lVar72 + 0x1694);
      auVar91 = *(undefined1 (*) [32])(bspline_basis0 + lVar72 + 0x1b18);
      auVar92 = *(undefined1 (*) [32])(bspline_basis0 + lVar72 + 0x1f9c);
      auVar101 = vfmadd213ps_avx512vl(auVar93,local_120,auVar101);
      auVar93 = vmulps_avx512vl(local_4c0,auVar92);
      auVar100 = vmulps_avx512vl(local_4e0,auVar92);
      auVar92 = vmulps_avx512vl(local_4a0,auVar92);
      auVar80 = vfmadd231ps_fma(auVar93,auVar91,local_560);
      auVar93 = vfmadd231ps_avx512vl(auVar100,auVar91,local_500);
      auVar91 = vfmadd231ps_avx512vl(auVar92,local_160,auVar91);
      auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar90,local_420);
      auVar178 = ZEXT3264(local_440);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar90,local_440);
      auVar100 = vfmadd231ps_avx512vl(auVar91,local_140,auVar90);
      auVar80 = vfmadd231ps_fma(auVar92,auVar89,local_3e0);
      auVar92 = vfmadd231ps_avx512vl(auVar93,auVar89,local_400);
      auVar93 = *(undefined1 (*) [32])(bspline_basis1 + lVar72 + 0x1210);
      auVar90 = *(undefined1 (*) [32])(bspline_basis1 + lVar72 + 0x1b18);
      auVar91 = *(undefined1 (*) [32])(bspline_basis1 + lVar72 + 0x1f9c);
      auVar100 = vfmadd231ps_avx512vl(auVar100,local_120,auVar89);
      auVar89 = vmulps_avx512vl(local_4c0,auVar91);
      auVar86 = vmulps_avx512vl(local_4e0,auVar91);
      auVar91 = vmulps_avx512vl(local_4a0,auVar91);
      auVar98 = vfmadd231ps_avx512vl(auVar89,auVar90,local_560);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar90,local_500);
      auVar90 = vfmadd231ps_avx512vl(auVar91,local_160,auVar90);
      auVar89 = *(undefined1 (*) [32])(bspline_basis1 + lVar72 + 0x1694);
      auVar91 = vfmadd231ps_avx512vl(auVar98,auVar89,local_420);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar89,local_440);
      auVar89 = vfmadd231ps_avx512vl(auVar90,local_140,auVar89);
      auVar77 = vfmadd231ps_fma(auVar91,auVar93,local_3e0);
      auVar90 = vfmadd231ps_avx512vl(auVar86,auVar93,local_400);
      auVar91 = vfmadd231ps_avx512vl(auVar89,local_120,auVar93);
      auVar175._8_4_ = 0x7fffffff;
      auVar175._0_8_ = 0x7fffffff7fffffff;
      auVar175._12_4_ = 0x7fffffff;
      auVar175._16_4_ = 0x7fffffff;
      auVar175._20_4_ = 0x7fffffff;
      auVar175._24_4_ = 0x7fffffff;
      auVar175._28_4_ = 0x7fffffff;
      auVar93 = vandps_avx(ZEXT1632(auVar80),auVar175);
      auVar89 = vandps_avx(auVar92,auVar175);
      auVar89 = vmaxps_avx(auVar93,auVar89);
      auVar93 = vandps_avx(auVar100,auVar175);
      auVar93 = vmaxps_avx(auVar89,auVar93);
      auVar100 = vbroadcastss_avx512vl(auVar78);
      uVar74 = vcmpps_avx512vl(auVar93,auVar100,1);
      bVar66 = (bool)((byte)uVar74 & 1);
      auVar102._0_4_ = (float)((uint)bVar66 * auVar88._0_4_ | (uint)!bVar66 * auVar80._0_4_);
      bVar66 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar102._4_4_ = (float)((uint)bVar66 * auVar88._4_4_ | (uint)!bVar66 * auVar80._4_4_);
      bVar66 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar102._8_4_ = (float)((uint)bVar66 * auVar88._8_4_ | (uint)!bVar66 * auVar80._8_4_);
      bVar66 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar102._12_4_ = (float)((uint)bVar66 * auVar88._12_4_ | (uint)!bVar66 * auVar80._12_4_);
      fVar140 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar88._16_4_);
      auVar102._16_4_ = fVar140;
      fVar132 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar88._20_4_);
      auVar102._20_4_ = fVar132;
      fVar141 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar88._24_4_);
      auVar102._24_4_ = fVar141;
      uVar1 = (uint)(byte)(uVar74 >> 7) * auVar88._28_4_;
      auVar102._28_4_ = uVar1;
      bVar66 = (bool)((byte)uVar74 & 1);
      auVar103._0_4_ = (float)((uint)bVar66 * auVar85._0_4_ | (uint)!bVar66 * auVar92._0_4_);
      bVar66 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar103._4_4_ = (float)((uint)bVar66 * auVar85._4_4_ | (uint)!bVar66 * auVar92._4_4_);
      bVar66 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar103._8_4_ = (float)((uint)bVar66 * auVar85._8_4_ | (uint)!bVar66 * auVar92._8_4_);
      bVar66 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar103._12_4_ = (float)((uint)bVar66 * auVar85._12_4_ | (uint)!bVar66 * auVar92._12_4_);
      bVar66 = (bool)((byte)(uVar74 >> 4) & 1);
      auVar103._16_4_ = (float)((uint)bVar66 * auVar85._16_4_ | (uint)!bVar66 * auVar92._16_4_);
      bVar66 = (bool)((byte)(uVar74 >> 5) & 1);
      auVar103._20_4_ = (float)((uint)bVar66 * auVar85._20_4_ | (uint)!bVar66 * auVar92._20_4_);
      bVar66 = (bool)((byte)(uVar74 >> 6) & 1);
      auVar103._24_4_ = (float)((uint)bVar66 * auVar85._24_4_ | (uint)!bVar66 * auVar92._24_4_);
      bVar66 = SUB81(uVar74 >> 7,0);
      auVar103._28_4_ = (uint)bVar66 * auVar85._28_4_ | (uint)!bVar66 * auVar92._28_4_;
      auVar93 = vandps_avx(auVar175,ZEXT1632(auVar77));
      auVar89 = vandps_avx(auVar90,auVar175);
      auVar89 = vmaxps_avx(auVar93,auVar89);
      auVar93 = vandps_avx(auVar91,auVar175);
      auVar93 = vmaxps_avx(auVar89,auVar93);
      uVar74 = vcmpps_avx512vl(auVar93,auVar100,1);
      bVar66 = (bool)((byte)uVar74 & 1);
      auVar104._0_4_ = (float)((uint)bVar66 * auVar88._0_4_ | (uint)!bVar66 * auVar77._0_4_);
      bVar66 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar104._4_4_ = (float)((uint)bVar66 * auVar88._4_4_ | (uint)!bVar66 * auVar77._4_4_);
      bVar66 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar104._8_4_ = (float)((uint)bVar66 * auVar88._8_4_ | (uint)!bVar66 * auVar77._8_4_);
      bVar66 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar104._12_4_ = (float)((uint)bVar66 * auVar88._12_4_ | (uint)!bVar66 * auVar77._12_4_);
      fVar161 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar88._16_4_);
      auVar104._16_4_ = fVar161;
      fVar160 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar88._20_4_);
      auVar104._20_4_ = fVar160;
      fVar162 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar88._24_4_);
      auVar104._24_4_ = fVar162;
      auVar104._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar88._28_4_;
      bVar66 = (bool)((byte)uVar74 & 1);
      auVar105._0_4_ = (float)((uint)bVar66 * auVar85._0_4_ | (uint)!bVar66 * auVar90._0_4_);
      bVar66 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar105._4_4_ = (float)((uint)bVar66 * auVar85._4_4_ | (uint)!bVar66 * auVar90._4_4_);
      bVar66 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar105._8_4_ = (float)((uint)bVar66 * auVar85._8_4_ | (uint)!bVar66 * auVar90._8_4_);
      bVar66 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar105._12_4_ = (float)((uint)bVar66 * auVar85._12_4_ | (uint)!bVar66 * auVar90._12_4_);
      bVar66 = (bool)((byte)(uVar74 >> 4) & 1);
      auVar105._16_4_ = (float)((uint)bVar66 * auVar85._16_4_ | (uint)!bVar66 * auVar90._16_4_);
      bVar66 = (bool)((byte)(uVar74 >> 5) & 1);
      auVar105._20_4_ = (float)((uint)bVar66 * auVar85._20_4_ | (uint)!bVar66 * auVar90._20_4_);
      bVar66 = (bool)((byte)(uVar74 >> 6) & 1);
      auVar105._24_4_ = (float)((uint)bVar66 * auVar85._24_4_ | (uint)!bVar66 * auVar90._24_4_);
      bVar66 = SUB81(uVar74 >> 7,0);
      auVar105._28_4_ = (uint)bVar66 * auVar85._28_4_ | (uint)!bVar66 * auVar90._28_4_;
      auVar82 = vxorps_avx512vl(local_560._0_16_,local_560._0_16_);
      auVar179 = ZEXT1664(auVar82);
      auVar93 = vfmadd213ps_avx512vl(auVar102,auVar102,ZEXT1632(auVar82));
      auVar80 = vfmadd231ps_fma(auVar93,auVar103,auVar103);
      auVar93 = vrsqrt14ps_avx512vl(ZEXT1632(auVar80));
      fVar75 = auVar93._0_4_;
      fVar146 = auVar93._4_4_;
      fVar124 = auVar93._8_4_;
      fVar125 = auVar93._12_4_;
      fVar126 = auVar93._16_4_;
      fVar127 = auVar93._20_4_;
      fVar128 = auVar93._24_4_;
      auVar30._4_4_ = fVar146 * fVar146 * fVar146 * auVar80._4_4_ * -0.5;
      auVar30._0_4_ = fVar75 * fVar75 * fVar75 * auVar80._0_4_ * -0.5;
      auVar30._8_4_ = fVar124 * fVar124 * fVar124 * auVar80._8_4_ * -0.5;
      auVar30._12_4_ = fVar125 * fVar125 * fVar125 * auVar80._12_4_ * -0.5;
      auVar30._16_4_ = fVar126 * fVar126 * fVar126 * -0.0;
      auVar30._20_4_ = fVar127 * fVar127 * fVar127 * -0.0;
      auVar30._24_4_ = fVar128 * fVar128 * fVar128 * -0.0;
      auVar30._28_4_ = 0;
      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar90 = vfmadd231ps_avx512vl(auVar30,auVar89,auVar93);
      auVar31._4_4_ = auVar103._4_4_ * auVar90._4_4_;
      auVar31._0_4_ = auVar103._0_4_ * auVar90._0_4_;
      auVar31._8_4_ = auVar103._8_4_ * auVar90._8_4_;
      auVar31._12_4_ = auVar103._12_4_ * auVar90._12_4_;
      auVar31._16_4_ = auVar103._16_4_ * auVar90._16_4_;
      auVar31._20_4_ = auVar103._20_4_ * auVar90._20_4_;
      auVar31._24_4_ = auVar103._24_4_ * auVar90._24_4_;
      auVar31._28_4_ = auVar93._28_4_;
      auVar32._4_4_ = auVar90._4_4_ * -auVar102._4_4_;
      auVar32._0_4_ = auVar90._0_4_ * -auVar102._0_4_;
      auVar32._8_4_ = auVar90._8_4_ * -auVar102._8_4_;
      auVar32._12_4_ = auVar90._12_4_ * -auVar102._12_4_;
      auVar32._16_4_ = auVar90._16_4_ * -fVar140;
      auVar32._20_4_ = auVar90._20_4_ * -fVar132;
      auVar32._24_4_ = auVar90._24_4_ * -fVar141;
      auVar32._28_4_ = uVar1 ^ 0x80000000;
      auVar93 = vmulps_avx512vl(auVar90,ZEXT1632(auVar82));
      auVar88 = ZEXT1632(auVar82);
      auVar91 = vfmadd213ps_avx512vl(auVar104,auVar104,auVar88);
      auVar80 = vfmadd231ps_fma(auVar91,auVar105,auVar105);
      auVar91 = vrsqrt14ps_avx512vl(ZEXT1632(auVar80));
      fVar132 = auVar91._0_4_;
      fVar140 = auVar91._4_4_;
      fVar141 = auVar91._8_4_;
      fVar75 = auVar91._12_4_;
      fVar146 = auVar91._16_4_;
      fVar124 = auVar91._20_4_;
      fVar125 = auVar91._24_4_;
      auVar33._4_4_ = fVar140 * fVar140 * fVar140 * auVar80._4_4_ * -0.5;
      auVar33._0_4_ = fVar132 * fVar132 * fVar132 * auVar80._0_4_ * -0.5;
      auVar33._8_4_ = fVar141 * fVar141 * fVar141 * auVar80._8_4_ * -0.5;
      auVar33._12_4_ = fVar75 * fVar75 * fVar75 * auVar80._12_4_ * -0.5;
      auVar33._16_4_ = fVar146 * fVar146 * fVar146 * -0.0;
      auVar33._20_4_ = fVar124 * fVar124 * fVar124 * -0.0;
      auVar33._24_4_ = fVar125 * fVar125 * fVar125 * -0.0;
      auVar33._28_4_ = 0;
      auVar89 = vfmadd231ps_avx512vl(auVar33,auVar89,auVar91);
      auVar34._4_4_ = auVar105._4_4_ * auVar89._4_4_;
      auVar34._0_4_ = auVar105._0_4_ * auVar89._0_4_;
      auVar34._8_4_ = auVar105._8_4_ * auVar89._8_4_;
      auVar34._12_4_ = auVar105._12_4_ * auVar89._12_4_;
      auVar34._16_4_ = auVar105._16_4_ * auVar89._16_4_;
      auVar34._20_4_ = auVar105._20_4_ * auVar89._20_4_;
      auVar34._24_4_ = auVar105._24_4_ * auVar89._24_4_;
      auVar34._28_4_ = auVar91._28_4_;
      auVar35._4_4_ = -auVar104._4_4_ * auVar89._4_4_;
      auVar35._0_4_ = -auVar104._0_4_ * auVar89._0_4_;
      auVar35._8_4_ = -auVar104._8_4_ * auVar89._8_4_;
      auVar35._12_4_ = -auVar104._12_4_ * auVar89._12_4_;
      auVar35._16_4_ = -fVar161 * auVar89._16_4_;
      auVar35._20_4_ = -fVar160 * auVar89._20_4_;
      auVar35._24_4_ = -fVar162 * auVar89._24_4_;
      auVar35._28_4_ = auVar90._28_4_;
      auVar89 = vmulps_avx512vl(auVar89,auVar88);
      auVar80 = vfmadd213ps_fma(auVar31,auVar97,auVar95);
      auVar77 = vfmadd213ps_fma(auVar32,auVar97,auVar96);
      auVar90 = vfmadd213ps_avx512vl(auVar93,auVar97,auVar101);
      auVar91 = vfmadd213ps_avx512vl(auVar34,ZEXT1632(auVar9),auVar87);
      auVar79 = vfnmadd213ps_fma(auVar31,auVar97,auVar95);
      auVar100 = ZEXT1632(auVar9);
      auVar76 = vfmadd213ps_fma(auVar35,auVar100,ZEXT1632(auVar8));
      auVar81 = vfnmadd213ps_fma(auVar32,auVar97,auVar96);
      auVar6 = vfmadd213ps_fma(auVar89,auVar100,auVar94);
      auVar92 = vfnmadd231ps_avx512vl(auVar101,auVar97,auVar93);
      auVar144 = vfnmadd213ps_fma(auVar34,auVar100,auVar87);
      auVar148 = vfnmadd213ps_fma(auVar35,auVar100,ZEXT1632(auVar8));
      auVar149 = vfnmadd231ps_fma(auVar94,ZEXT1632(auVar9),auVar89);
      auVar89 = vsubps_avx512vl(auVar91,ZEXT1632(auVar79));
      auVar93 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar81));
      auVar94 = vsubps_avx512vl(ZEXT1632(auVar6),auVar92);
      auVar101 = vmulps_avx512vl(auVar93,auVar92);
      auVar7 = vfmsub231ps_fma(auVar101,ZEXT1632(auVar81),auVar94);
      auVar36._4_4_ = auVar79._4_4_ * auVar94._4_4_;
      auVar36._0_4_ = auVar79._0_4_ * auVar94._0_4_;
      auVar36._8_4_ = auVar79._8_4_ * auVar94._8_4_;
      auVar36._12_4_ = auVar79._12_4_ * auVar94._12_4_;
      auVar36._16_4_ = auVar94._16_4_ * 0.0;
      auVar36._20_4_ = auVar94._20_4_ * 0.0;
      auVar36._24_4_ = auVar94._24_4_ * 0.0;
      auVar36._28_4_ = auVar94._28_4_;
      auVar94 = vfmsub231ps_avx512vl(auVar36,auVar92,auVar89);
      auVar37._4_4_ = auVar81._4_4_ * auVar89._4_4_;
      auVar37._0_4_ = auVar81._0_4_ * auVar89._0_4_;
      auVar37._8_4_ = auVar81._8_4_ * auVar89._8_4_;
      auVar37._12_4_ = auVar81._12_4_ * auVar89._12_4_;
      auVar37._16_4_ = auVar89._16_4_ * 0.0;
      auVar37._20_4_ = auVar89._20_4_ * 0.0;
      auVar37._24_4_ = auVar89._24_4_ * 0.0;
      auVar37._28_4_ = auVar89._28_4_;
      auVar8 = vfmsub231ps_fma(auVar37,ZEXT1632(auVar79),auVar93);
      auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar88,auVar94);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,ZEXT1632(auVar7));
      auVar88 = ZEXT1632(auVar82);
      uVar74 = vcmpps_avx512vl(auVar93,auVar88,2);
      bVar67 = (byte)uVar74;
      fVar75 = (float)((uint)(bVar67 & 1) * auVar80._0_4_ |
                      (uint)!(bool)(bVar67 & 1) * auVar144._0_4_);
      bVar66 = (bool)((byte)(uVar74 >> 1) & 1);
      fVar124 = (float)((uint)bVar66 * auVar80._4_4_ | (uint)!bVar66 * auVar144._4_4_);
      bVar66 = (bool)((byte)(uVar74 >> 2) & 1);
      fVar126 = (float)((uint)bVar66 * auVar80._8_4_ | (uint)!bVar66 * auVar144._8_4_);
      bVar66 = (bool)((byte)(uVar74 >> 3) & 1);
      fVar128 = (float)((uint)bVar66 * auVar80._12_4_ | (uint)!bVar66 * auVar144._12_4_);
      auVar101 = ZEXT1632(CONCAT412(fVar128,CONCAT48(fVar126,CONCAT44(fVar124,fVar75))));
      fVar146 = (float)((uint)(bVar67 & 1) * auVar77._0_4_ |
                       (uint)!(bool)(bVar67 & 1) * auVar148._0_4_);
      bVar66 = (bool)((byte)(uVar74 >> 1) & 1);
      fVar125 = (float)((uint)bVar66 * auVar77._4_4_ | (uint)!bVar66 * auVar148._4_4_);
      bVar66 = (bool)((byte)(uVar74 >> 2) & 1);
      fVar127 = (float)((uint)bVar66 * auVar77._8_4_ | (uint)!bVar66 * auVar148._8_4_);
      bVar66 = (bool)((byte)(uVar74 >> 3) & 1);
      fVar129 = (float)((uint)bVar66 * auVar77._12_4_ | (uint)!bVar66 * auVar148._12_4_);
      auVar100 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar127,CONCAT44(fVar125,fVar146))));
      auVar106._0_4_ =
           (float)((uint)(bVar67 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar149._0_4_);
      bVar66 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar106._4_4_ = (float)((uint)bVar66 * auVar90._4_4_ | (uint)!bVar66 * auVar149._4_4_);
      bVar66 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar106._8_4_ = (float)((uint)bVar66 * auVar90._8_4_ | (uint)!bVar66 * auVar149._8_4_);
      bVar66 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar106._12_4_ = (float)((uint)bVar66 * auVar90._12_4_ | (uint)!bVar66 * auVar149._12_4_);
      fVar132 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar90._16_4_);
      auVar106._16_4_ = fVar132;
      fVar140 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar90._20_4_);
      auVar106._20_4_ = fVar140;
      fVar141 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar90._24_4_);
      auVar106._24_4_ = fVar141;
      iVar2 = (uint)(byte)(uVar74 >> 7) * auVar90._28_4_;
      auVar106._28_4_ = iVar2;
      auVar89 = vblendmps_avx512vl(ZEXT1632(auVar79),auVar91);
      auVar107._0_4_ = (uint)(bVar67 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar7._0_4_
      ;
      bVar66 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar107._4_4_ = (uint)bVar66 * auVar89._4_4_ | (uint)!bVar66 * auVar7._4_4_;
      bVar66 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar107._8_4_ = (uint)bVar66 * auVar89._8_4_ | (uint)!bVar66 * auVar7._8_4_;
      bVar66 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar107._12_4_ = (uint)bVar66 * auVar89._12_4_ | (uint)!bVar66 * auVar7._12_4_;
      auVar107._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * auVar89._16_4_;
      auVar107._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * auVar89._20_4_;
      auVar107._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * auVar89._24_4_;
      auVar107._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar89._28_4_;
      auVar89 = vblendmps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar76));
      auVar108._0_4_ =
           (float)((uint)(bVar67 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar77._0_4_);
      bVar66 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar108._4_4_ = (float)((uint)bVar66 * auVar89._4_4_ | (uint)!bVar66 * auVar77._4_4_);
      bVar66 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar108._8_4_ = (float)((uint)bVar66 * auVar89._8_4_ | (uint)!bVar66 * auVar77._8_4_);
      bVar66 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar108._12_4_ = (float)((uint)bVar66 * auVar89._12_4_ | (uint)!bVar66 * auVar77._12_4_);
      fVar162 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar89._16_4_);
      auVar108._16_4_ = fVar162;
      fVar160 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar89._20_4_);
      auVar108._20_4_ = fVar160;
      fVar161 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar89._24_4_);
      auVar108._24_4_ = fVar161;
      auVar108._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar89._28_4_;
      auVar89 = vblendmps_avx512vl(auVar92,ZEXT1632(auVar6));
      auVar109._0_4_ =
           (float)((uint)(bVar67 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar90._0_4_);
      bVar66 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar66 * auVar89._4_4_ | (uint)!bVar66 * auVar90._4_4_);
      bVar66 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar66 * auVar89._8_4_ | (uint)!bVar66 * auVar90._8_4_);
      bVar66 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar66 * auVar89._12_4_ | (uint)!bVar66 * auVar90._12_4_);
      bVar66 = (bool)((byte)(uVar74 >> 4) & 1);
      auVar109._16_4_ = (float)((uint)bVar66 * auVar89._16_4_ | (uint)!bVar66 * auVar90._16_4_);
      bVar66 = (bool)((byte)(uVar74 >> 5) & 1);
      auVar109._20_4_ = (float)((uint)bVar66 * auVar89._20_4_ | (uint)!bVar66 * auVar90._20_4_);
      bVar66 = (bool)((byte)(uVar74 >> 6) & 1);
      auVar109._24_4_ = (float)((uint)bVar66 * auVar89._24_4_ | (uint)!bVar66 * auVar90._24_4_);
      bVar66 = SUB81(uVar74 >> 7,0);
      auVar109._28_4_ = (uint)bVar66 * auVar89._28_4_ | (uint)!bVar66 * auVar90._28_4_;
      auVar110._0_4_ =
           (uint)(bVar67 & 1) * (int)auVar79._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar91._0_4_;
      bVar66 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar110._4_4_ = (uint)bVar66 * (int)auVar79._4_4_ | (uint)!bVar66 * auVar91._4_4_;
      bVar66 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar110._8_4_ = (uint)bVar66 * (int)auVar79._8_4_ | (uint)!bVar66 * auVar91._8_4_;
      bVar66 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar110._12_4_ = (uint)bVar66 * (int)auVar79._12_4_ | (uint)!bVar66 * auVar91._12_4_;
      auVar110._16_4_ = (uint)!(bool)((byte)(uVar74 >> 4) & 1) * auVar91._16_4_;
      auVar110._20_4_ = (uint)!(bool)((byte)(uVar74 >> 5) & 1) * auVar91._20_4_;
      auVar110._24_4_ = (uint)!(bool)((byte)(uVar74 >> 6) & 1) * auVar91._24_4_;
      auVar110._28_4_ = (uint)!SUB81(uVar74 >> 7,0) * auVar91._28_4_;
      bVar66 = (bool)((byte)(uVar74 >> 1) & 1);
      bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
      bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar111._0_4_ = (uint)(bVar67 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar6._0_4_
      ;
      bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar111._4_4_ = (uint)bVar12 * auVar92._4_4_ | (uint)!bVar12 * auVar6._4_4_;
      bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar111._8_4_ = (uint)bVar12 * auVar92._8_4_ | (uint)!bVar12 * auVar6._8_4_;
      bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar111._12_4_ = (uint)bVar12 * auVar92._12_4_ | (uint)!bVar12 * auVar6._12_4_;
      auVar111._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * auVar92._16_4_;
      auVar111._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * auVar92._20_4_;
      auVar111._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * auVar92._24_4_;
      iVar3 = (uint)(byte)(uVar74 >> 7) * auVar92._28_4_;
      auVar111._28_4_ = iVar3;
      auVar95 = vsubps_avx512vl(auVar110,auVar101);
      auVar89 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar81._12_4_ |
                                              (uint)!bVar15 * auVar76._12_4_,
                                              CONCAT48((uint)bVar13 * (int)auVar81._8_4_ |
                                                       (uint)!bVar13 * auVar76._8_4_,
                                                       CONCAT44((uint)bVar66 * (int)auVar81._4_4_ |
                                                                (uint)!bVar66 * auVar76._4_4_,
                                                                (uint)(bVar67 & 1) *
                                                                (int)auVar81._0_4_ |
                                                                (uint)!(bool)(bVar67 & 1) *
                                                                auVar76._0_4_)))),auVar100);
      auVar90 = vsubps_avx(auVar111,auVar106);
      auVar91 = vsubps_avx(auVar101,auVar107);
      auVar92 = vsubps_avx(auVar100,auVar108);
      auVar94 = vsubps_avx(auVar106,auVar109);
      auVar38._4_4_ = auVar90._4_4_ * fVar124;
      auVar38._0_4_ = auVar90._0_4_ * fVar75;
      auVar38._8_4_ = auVar90._8_4_ * fVar126;
      auVar38._12_4_ = auVar90._12_4_ * fVar128;
      auVar38._16_4_ = auVar90._16_4_ * 0.0;
      auVar38._20_4_ = auVar90._20_4_ * 0.0;
      auVar38._24_4_ = auVar90._24_4_ * 0.0;
      auVar38._28_4_ = iVar3;
      auVar80 = vfmsub231ps_fma(auVar38,auVar106,auVar95);
      auVar39._4_4_ = fVar125 * auVar95._4_4_;
      auVar39._0_4_ = fVar146 * auVar95._0_4_;
      auVar39._8_4_ = fVar127 * auVar95._8_4_;
      auVar39._12_4_ = fVar129 * auVar95._12_4_;
      auVar39._16_4_ = auVar95._16_4_ * 0.0;
      auVar39._20_4_ = auVar95._20_4_ * 0.0;
      auVar39._24_4_ = auVar95._24_4_ * 0.0;
      auVar39._28_4_ = auVar93._28_4_;
      auVar77 = vfmsub231ps_fma(auVar39,auVar101,auVar89);
      auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar88,ZEXT1632(auVar80));
      auVar156._0_4_ = auVar89._0_4_ * auVar106._0_4_;
      auVar156._4_4_ = auVar89._4_4_ * auVar106._4_4_;
      auVar156._8_4_ = auVar89._8_4_ * auVar106._8_4_;
      auVar156._12_4_ = auVar89._12_4_ * auVar106._12_4_;
      auVar156._16_4_ = auVar89._16_4_ * fVar132;
      auVar156._20_4_ = auVar89._20_4_ * fVar140;
      auVar156._24_4_ = auVar89._24_4_ * fVar141;
      auVar156._28_4_ = 0;
      auVar80 = vfmsub231ps_fma(auVar156,auVar100,auVar90);
      auVar96 = vfmadd231ps_avx512vl(auVar93,auVar88,ZEXT1632(auVar80));
      auVar93 = vmulps_avx512vl(auVar94,auVar107);
      auVar93 = vfmsub231ps_avx512vl(auVar93,auVar91,auVar109);
      auVar40._4_4_ = auVar92._4_4_ * auVar109._4_4_;
      auVar40._0_4_ = auVar92._0_4_ * auVar109._0_4_;
      auVar40._8_4_ = auVar92._8_4_ * auVar109._8_4_;
      auVar40._12_4_ = auVar92._12_4_ * auVar109._12_4_;
      auVar40._16_4_ = auVar92._16_4_ * auVar109._16_4_;
      auVar40._20_4_ = auVar92._20_4_ * auVar109._20_4_;
      auVar40._24_4_ = auVar92._24_4_ * auVar109._24_4_;
      auVar40._28_4_ = auVar109._28_4_;
      auVar80 = vfmsub231ps_fma(auVar40,auVar108,auVar94);
      auVar157._0_4_ = auVar108._0_4_ * auVar91._0_4_;
      auVar157._4_4_ = auVar108._4_4_ * auVar91._4_4_;
      auVar157._8_4_ = auVar108._8_4_ * auVar91._8_4_;
      auVar157._12_4_ = auVar108._12_4_ * auVar91._12_4_;
      auVar157._16_4_ = fVar162 * auVar91._16_4_;
      auVar157._20_4_ = fVar160 * auVar91._20_4_;
      auVar157._24_4_ = fVar161 * auVar91._24_4_;
      auVar157._28_4_ = 0;
      auVar77 = vfmsub231ps_fma(auVar157,auVar92,auVar107);
      auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar88,auVar93);
      auVar87 = vfmadd231ps_avx512vl(auVar93,auVar88,ZEXT1632(auVar80));
      auVar93 = vmaxps_avx(auVar96,auVar87);
      uVar142 = vcmpps_avx512vl(auVar93,auVar88,2);
      bVar73 = bVar73 & (byte)uVar142;
      auVar180 = ZEXT3264(local_3e0);
      auVar181 = ZEXT3264(local_400);
      auVar182 = ZEXT3264(local_420);
      auVar177 = ZEXT3264(local_560);
      auVar173 = ZEXT1664(auVar78);
      if (bVar73 == 0) {
        bVar66 = false;
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar186 = ZEXT3264(auVar93);
        auVar183 = ZEXT3264(local_500);
        auVar184 = ZEXT3264(local_4c0);
        auVar185 = ZEXT3264(local_4e0);
      }
      else {
        auVar41._4_4_ = auVar94._4_4_ * auVar89._4_4_;
        auVar41._0_4_ = auVar94._0_4_ * auVar89._0_4_;
        auVar41._8_4_ = auVar94._8_4_ * auVar89._8_4_;
        auVar41._12_4_ = auVar94._12_4_ * auVar89._12_4_;
        auVar41._16_4_ = auVar94._16_4_ * auVar89._16_4_;
        auVar41._20_4_ = auVar94._20_4_ * auVar89._20_4_;
        auVar41._24_4_ = auVar94._24_4_ * auVar89._24_4_;
        auVar41._28_4_ = auVar93._28_4_;
        auVar76 = vfmsub231ps_fma(auVar41,auVar92,auVar90);
        auVar42._4_4_ = auVar90._4_4_ * auVar91._4_4_;
        auVar42._0_4_ = auVar90._0_4_ * auVar91._0_4_;
        auVar42._8_4_ = auVar90._8_4_ * auVar91._8_4_;
        auVar42._12_4_ = auVar90._12_4_ * auVar91._12_4_;
        auVar42._16_4_ = auVar90._16_4_ * auVar91._16_4_;
        auVar42._20_4_ = auVar90._20_4_ * auVar91._20_4_;
        auVar42._24_4_ = auVar90._24_4_ * auVar91._24_4_;
        auVar42._28_4_ = auVar90._28_4_;
        auVar77 = vfmsub231ps_fma(auVar42,auVar95,auVar94);
        auVar43._4_4_ = auVar92._4_4_ * auVar95._4_4_;
        auVar43._0_4_ = auVar92._0_4_ * auVar95._0_4_;
        auVar43._8_4_ = auVar92._8_4_ * auVar95._8_4_;
        auVar43._12_4_ = auVar92._12_4_ * auVar95._12_4_;
        auVar43._16_4_ = auVar92._16_4_ * auVar95._16_4_;
        auVar43._20_4_ = auVar92._20_4_ * auVar95._20_4_;
        auVar43._24_4_ = auVar92._24_4_ * auVar95._24_4_;
        auVar43._28_4_ = auVar92._28_4_;
        auVar6 = vfmsub231ps_fma(auVar43,auVar91,auVar89);
        auVar80 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar77),ZEXT1632(auVar6));
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar76),auVar88);
        auVar89 = vrcp14ps_avx512vl(auVar93);
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar186 = ZEXT3264(auVar90);
        auVar91 = vfnmadd213ps_avx512vl(auVar89,auVar93,auVar90);
        auVar80 = vfmadd132ps_fma(auVar91,auVar89,auVar89);
        auVar44._4_4_ = auVar6._4_4_ * auVar106._4_4_;
        auVar44._0_4_ = auVar6._0_4_ * auVar106._0_4_;
        auVar44._8_4_ = auVar6._8_4_ * auVar106._8_4_;
        auVar44._12_4_ = auVar6._12_4_ * auVar106._12_4_;
        auVar44._16_4_ = fVar132 * 0.0;
        auVar44._20_4_ = fVar140 * 0.0;
        auVar44._24_4_ = fVar141 * 0.0;
        auVar44._28_4_ = iVar2;
        auVar77 = vfmadd231ps_fma(auVar44,auVar100,ZEXT1632(auVar77));
        auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar101,ZEXT1632(auVar76));
        fVar132 = auVar80._0_4_;
        fVar140 = auVar80._4_4_;
        fVar141 = auVar80._8_4_;
        fVar161 = auVar80._12_4_;
        local_240 = ZEXT1632(CONCAT412(auVar77._12_4_ * fVar161,
                                       CONCAT48(auVar77._8_4_ * fVar141,
                                                CONCAT44(auVar77._4_4_ * fVar140,
                                                         auVar77._0_4_ * fVar132))));
        auVar164._4_4_ = uVar133;
        auVar164._0_4_ = uVar133;
        auVar164._8_4_ = uVar133;
        auVar164._12_4_ = uVar133;
        auVar164._16_4_ = uVar133;
        auVar164._20_4_ = uVar133;
        auVar164._24_4_ = uVar133;
        auVar164._28_4_ = uVar133;
        uVar142 = vcmpps_avx512vl(auVar164,local_240,2);
        uVar134 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar23._4_4_ = uVar134;
        auVar23._0_4_ = uVar134;
        auVar23._8_4_ = uVar134;
        auVar23._12_4_ = uVar134;
        auVar23._16_4_ = uVar134;
        auVar23._20_4_ = uVar134;
        auVar23._24_4_ = uVar134;
        auVar23._28_4_ = uVar134;
        uVar18 = vcmpps_avx512vl(local_240,auVar23,2);
        bVar73 = (byte)uVar142 & (byte)uVar18 & bVar73;
        auVar184 = ZEXT3264(local_4c0);
        auVar185 = ZEXT3264(local_4e0);
        if (bVar73 == 0) {
          bVar66 = false;
          auVar183 = ZEXT3264(local_500);
        }
        else {
          uVar142 = vcmpps_avx512vl(auVar93,auVar88,4);
          bVar73 = bVar73 & (byte)uVar142;
          auVar165 = ZEXT1664(local_5c0);
          auVar183 = ZEXT3264(local_500);
          if (bVar73 != 0) {
            fVar160 = auVar96._0_4_ * fVar132;
            fVar162 = auVar96._4_4_ * fVar140;
            auVar45._4_4_ = fVar162;
            auVar45._0_4_ = fVar160;
            fVar75 = auVar96._8_4_ * fVar141;
            auVar45._8_4_ = fVar75;
            fVar146 = auVar96._12_4_ * fVar161;
            auVar45._12_4_ = fVar146;
            fVar124 = auVar96._16_4_ * 0.0;
            auVar45._16_4_ = fVar124;
            fVar125 = auVar96._20_4_ * 0.0;
            auVar45._20_4_ = fVar125;
            fVar126 = auVar96._24_4_ * 0.0;
            auVar45._24_4_ = fVar126;
            auVar45._28_4_ = auVar93._28_4_;
            auVar89 = vsubps_avx512vl(auVar90,auVar45);
            local_280._0_4_ =
                 (float)((uint)(bVar67 & 1) * (int)fVar160 |
                        (uint)!(bool)(bVar67 & 1) * auVar89._0_4_);
            bVar66 = (bool)((byte)(uVar74 >> 1) & 1);
            local_280._4_4_ = (float)((uint)bVar66 * (int)fVar162 | (uint)!bVar66 * auVar89._4_4_);
            bVar66 = (bool)((byte)(uVar74 >> 2) & 1);
            local_280._8_4_ = (float)((uint)bVar66 * (int)fVar75 | (uint)!bVar66 * auVar89._8_4_);
            bVar66 = (bool)((byte)(uVar74 >> 3) & 1);
            local_280._12_4_ = (float)((uint)bVar66 * (int)fVar146 | (uint)!bVar66 * auVar89._12_4_)
            ;
            bVar66 = (bool)((byte)(uVar74 >> 4) & 1);
            local_280._16_4_ = (float)((uint)bVar66 * (int)fVar124 | (uint)!bVar66 * auVar89._16_4_)
            ;
            bVar66 = (bool)((byte)(uVar74 >> 5) & 1);
            local_280._20_4_ = (float)((uint)bVar66 * (int)fVar125 | (uint)!bVar66 * auVar89._20_4_)
            ;
            bVar66 = (bool)((byte)(uVar74 >> 6) & 1);
            local_280._24_4_ = (float)((uint)bVar66 * (int)fVar126 | (uint)!bVar66 * auVar89._24_4_)
            ;
            bVar66 = SUB81(uVar74 >> 7,0);
            local_280._28_4_ =
                 (float)((uint)bVar66 * auVar93._28_4_ | (uint)!bVar66 * auVar89._28_4_);
            auVar93 = vsubps_avx(ZEXT1632(auVar9),auVar97);
            auVar80 = vfmadd213ps_fma(auVar93,local_280,auVar97);
            uVar134 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
            auVar24._4_4_ = uVar134;
            auVar24._0_4_ = uVar134;
            auVar24._8_4_ = uVar134;
            auVar24._12_4_ = uVar134;
            auVar24._16_4_ = uVar134;
            auVar24._20_4_ = uVar134;
            auVar24._24_4_ = uVar134;
            auVar24._28_4_ = uVar134;
            auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar80._12_4_ + auVar80._12_4_,
                                                         CONCAT48(auVar80._8_4_ + auVar80._8_4_,
                                                                  CONCAT44(auVar80._4_4_ +
                                                                           auVar80._4_4_,
                                                                           auVar80._0_4_ +
                                                                           auVar80._0_4_)))),auVar24
                                     );
            uVar142 = vcmpps_avx512vl(local_240,auVar93,6);
            if (((byte)uVar142 & bVar73) != 0) {
              auVar150._0_4_ = auVar87._0_4_ * fVar132;
              auVar150._4_4_ = auVar87._4_4_ * fVar140;
              auVar150._8_4_ = auVar87._8_4_ * fVar141;
              auVar150._12_4_ = auVar87._12_4_ * fVar161;
              auVar150._16_4_ = auVar87._16_4_ * 0.0;
              auVar150._20_4_ = auVar87._20_4_ * 0.0;
              auVar150._24_4_ = auVar87._24_4_ * 0.0;
              auVar150._28_4_ = 0;
              auVar93 = vsubps_avx512vl(auVar90,auVar150);
              auVar112._0_4_ =
                   (uint)(bVar67 & 1) * (int)auVar150._0_4_ |
                   (uint)!(bool)(bVar67 & 1) * auVar93._0_4_;
              bVar66 = (bool)((byte)(uVar74 >> 1) & 1);
              auVar112._4_4_ = (uint)bVar66 * (int)auVar150._4_4_ | (uint)!bVar66 * auVar93._4_4_;
              bVar66 = (bool)((byte)(uVar74 >> 2) & 1);
              auVar112._8_4_ = (uint)bVar66 * (int)auVar150._8_4_ | (uint)!bVar66 * auVar93._8_4_;
              bVar66 = (bool)((byte)(uVar74 >> 3) & 1);
              auVar112._12_4_ = (uint)bVar66 * (int)auVar150._12_4_ | (uint)!bVar66 * auVar93._12_4_
              ;
              bVar66 = (bool)((byte)(uVar74 >> 4) & 1);
              auVar112._16_4_ = (uint)bVar66 * (int)auVar150._16_4_ | (uint)!bVar66 * auVar93._16_4_
              ;
              bVar66 = (bool)((byte)(uVar74 >> 5) & 1);
              auVar112._20_4_ = (uint)bVar66 * (int)auVar150._20_4_ | (uint)!bVar66 * auVar93._20_4_
              ;
              bVar66 = (bool)((byte)(uVar74 >> 6) & 1);
              auVar112._24_4_ = (uint)bVar66 * (int)auVar150._24_4_ | (uint)!bVar66 * auVar93._24_4_
              ;
              auVar112._28_4_ = (uint)!SUB81(uVar74 >> 7,0) * auVar93._28_4_;
              auVar25._8_4_ = 0x40000000;
              auVar25._0_8_ = 0x4000000040000000;
              auVar25._12_4_ = 0x40000000;
              auVar25._16_4_ = 0x40000000;
              auVar25._20_4_ = 0x40000000;
              auVar25._24_4_ = 0x40000000;
              auVar25._28_4_ = 0x40000000;
              local_260 = vfmsub132ps_avx512vl(auVar112,auVar90,auVar25);
              local_220 = 0;
              local_200 = local_510._0_8_;
              uStack_1f8 = local_510._8_8_;
              local_1f0 = local_520._0_8_;
              uStack_1e8 = local_520._8_8_;
              if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar66 = true, pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_019eaec4;
                fVar147 = 1.0 / fVar147;
                local_1c0[0] = fVar147 * (local_280._0_4_ + 0.0);
                local_1c0[1] = fVar147 * (local_280._4_4_ + 1.0);
                local_1c0[2] = fVar147 * (local_280._8_4_ + 2.0);
                local_1c0[3] = fVar147 * (local_280._12_4_ + 3.0);
                fStack_1b0 = fVar147 * (local_280._16_4_ + 4.0);
                fStack_1ac = fVar147 * (local_280._20_4_ + 5.0);
                fStack_1a8 = fVar147 * (local_280._24_4_ + 6.0);
                fStack_1a4 = local_280._28_4_ + 7.0;
                local_1a0 = local_260;
                local_180 = local_240;
                local_460 = (float)(uint)((byte)uVar142 & bVar73);
                lVar71 = 0;
                for (uVar74 = (ulong)(uint)local_460; (uVar74 & 1) == 0;
                    uVar74 = uVar74 >> 1 | 0x8000000000000000) {
                  lVar71 = lVar71 + 1;
                }
                local_3c0._0_8_ = lVar71;
                _local_2a0 = vpbroadcastd_avx512vl();
                uVar74 = (ulong)(uint)local_460;
                local_5b0 = auVar78;
                local_21c = iVar19;
                local_210 = local_5c0;
                while( true ) {
                  local_460 = auVar173._0_4_;
                  auVar78 = auVar179._0_16_;
                  if (uVar74 == 0) break;
                  local_460 = (float)uVar74;
                  fStack_45c = (float)(uVar74 >> 0x20);
                  local_360 = *(undefined4 *)(ray + k * 4 + 0x80);
                  fVar147 = local_1c0[local_3c0._0_8_];
                  local_300._4_4_ = fVar147;
                  local_300._0_4_ = fVar147;
                  local_300._8_4_ = fVar147;
                  local_300._12_4_ = fVar147;
                  local_2f0 = *(undefined4 *)(local_1a0 + local_3c0._0_8_ * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) =
                       *(undefined4 *)(local_180 + local_3c0._0_8_ * 4);
                  local_590.context = context->user;
                  fVar132 = 1.0 - fVar147;
                  auVar21._8_4_ = 0x80000000;
                  auVar21._0_8_ = 0x8000000080000000;
                  auVar21._12_4_ = 0x80000000;
                  auVar76 = vxorps_avx512vl(ZEXT416((uint)fVar132),auVar21);
                  auVar80 = ZEXT416((uint)(fVar147 * fVar132 * 4.0));
                  auVar77 = vfnmsub213ss_fma(local_300,local_300,auVar80);
                  auVar80 = vfmadd213ss_fma(ZEXT416((uint)fVar132),ZEXT416((uint)fVar132),auVar80);
                  fVar132 = fVar132 * auVar76._0_4_ * 0.5;
                  fVar140 = auVar77._0_4_ * 0.5;
                  fVar141 = auVar80._0_4_ * 0.5;
                  fVar147 = fVar147 * fVar147 * 0.5;
                  auVar152._0_4_ = fVar147 * (float)local_370._0_4_;
                  auVar152._4_4_ = fVar147 * (float)local_370._4_4_;
                  auVar152._8_4_ = fVar147 * fStack_368;
                  auVar152._12_4_ = fVar147 * fStack_364;
                  auVar135._4_4_ = fVar141;
                  auVar135._0_4_ = fVar141;
                  auVar135._8_4_ = fVar141;
                  auVar135._12_4_ = fVar141;
                  auVar80 = vfmadd132ps_fma(auVar135,auVar152,local_520);
                  auVar153._4_4_ = fVar140;
                  auVar153._0_4_ = fVar140;
                  auVar153._8_4_ = fVar140;
                  auVar153._12_4_ = fVar140;
                  auVar80 = vfmadd132ps_fma(auVar153,auVar80,local_510);
                  auVar136._4_4_ = fVar132;
                  auVar136._0_4_ = fVar132;
                  auVar136._8_4_ = fVar132;
                  auVar136._12_4_ = fVar132;
                  auVar80 = vfmadd213ps_fma(auVar136,auVar165._0_16_,auVar80);
                  uVar134 = auVar80._0_4_;
                  local_330._4_4_ = uVar134;
                  local_330._0_4_ = uVar134;
                  local_330._8_4_ = uVar134;
                  local_330._12_4_ = uVar134;
                  local_320 = vshufps_avx(auVar80,auVar80,0x55);
                  local_310 = vshufps_avx(auVar80,auVar80,0xaa);
                  local_2e0 = local_380._0_8_;
                  uStack_2d8 = local_380._8_8_;
                  local_2d0 = _local_2a0;
                  vpcmpeqd_avx2(ZEXT1632(_local_2a0),ZEXT1632(_local_2a0));
                  uStack_2bc = (local_590.context)->instID[0];
                  local_2c0 = uStack_2bc;
                  uStack_2b8 = uStack_2bc;
                  uStack_2b4 = uStack_2bc;
                  uStack_2b0 = (local_590.context)->instPrimID[0];
                  uStack_2ac = uStack_2b0;
                  uStack_2a8 = uStack_2b0;
                  uStack_2a4 = uStack_2b0;
                  local_5e0 = local_390;
                  local_590.valid = (int *)local_5e0;
                  local_590.geometryUserPtr = pGVar10->userPtr;
                  local_590.hit = local_330;
                  local_590.N = 4;
                  local_590.ray = (RTCRayN *)ray;
                  uStack_2ec = local_2f0;
                  uStack_2e8 = local_2f0;
                  uStack_2e4 = local_2f0;
                  if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar10->occlusionFilterN)(&local_590);
                    auVar173 = ZEXT1664(local_5b0);
                    auVar185 = ZEXT3264(local_4e0);
                    auVar184 = ZEXT3264(local_4c0);
                    auVar183 = ZEXT3264(local_500);
                    auVar177 = ZEXT3264(local_560);
                    auVar178 = ZEXT3264(local_440);
                    auVar182 = ZEXT3264(local_420);
                    auVar181 = ZEXT3264(local_400);
                    auVar180 = ZEXT3264(local_3e0);
                    auVar165 = ZEXT1664(local_5c0);
                    auVar78 = vxorps_avx512vl(auVar78,auVar78);
                    auVar179 = ZEXT1664(auVar78);
                    auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar186 = ZEXT3264(auVar93);
                  }
                  auVar78 = auVar179._0_16_;
                  uVar74 = vptestmd_avx512vl(local_5e0,local_5e0);
                  if ((uVar74 & 0xf) != 0) {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&local_590);
                      auVar173 = ZEXT1664(local_5b0);
                      auVar185 = ZEXT3264(local_4e0);
                      auVar184 = ZEXT3264(local_4c0);
                      auVar183 = ZEXT3264(local_500);
                      auVar177 = ZEXT3264(local_560);
                      auVar178 = ZEXT3264(local_440);
                      auVar182 = ZEXT3264(local_420);
                      auVar181 = ZEXT3264(local_400);
                      auVar180 = ZEXT3264(local_3e0);
                      auVar165 = ZEXT1664(local_5c0);
                      auVar78 = vxorps_avx512vl(auVar78,auVar78);
                      auVar179 = ZEXT1664(auVar78);
                      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar186 = ZEXT3264(auVar93);
                    }
                    auVar78 = *(undefined1 (*) [16])(local_590.ray + 0x80);
                    uVar74 = vptestmd_avx512vl(local_5e0,local_5e0);
                    uVar74 = uVar74 & 0xf;
                    auVar80 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar66 = (bool)((byte)uVar74 & 1);
                    auVar83._0_4_ = (uint)bVar66 * auVar80._0_4_ | (uint)!bVar66 * auVar78._0_4_;
                    bVar66 = (bool)((byte)(uVar74 >> 1) & 1);
                    auVar83._4_4_ = (uint)bVar66 * auVar80._4_4_ | (uint)!bVar66 * auVar78._4_4_;
                    bVar66 = (bool)((byte)(uVar74 >> 2) & 1);
                    auVar83._8_4_ = (uint)bVar66 * auVar80._8_4_ | (uint)!bVar66 * auVar78._8_4_;
                    bVar66 = SUB81(uVar74 >> 3,0);
                    auVar83._12_4_ = (uint)bVar66 * auVar80._12_4_ | (uint)!bVar66 * auVar78._12_4_;
                    *(undefined1 (*) [16])(local_590.ray + 0x80) = auVar83;
                    if ((byte)uVar74 != 0) {
                      bVar66 = true;
                      local_460 = auVar173._0_4_;
                      goto LAB_019eaec4;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_360;
                  lVar71 = 0;
                  uVar74 = CONCAT44(fStack_45c,local_460) ^ 1L << (local_3c0._0_8_ & 0x3f);
                  for (uVar20 = uVar74; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000
                      ) {
                    lVar71 = lVar71 + 1;
                  }
                  local_3c0._0_8_ = lVar71;
                }
              }
            }
          }
          bVar66 = false;
        }
      }
    }
LAB_019eaec4:
    if (8 < iVar19) {
      local_3c0 = vpbroadcastd_avx512vl();
      fStack_290 = 1.0 / (float)local_530._0_4_;
      local_2a0._4_4_ = fStack_290;
      local_2a0._0_4_ = fStack_290;
      fStack_298 = fStack_290;
      fStack_294 = fStack_290;
      local_530 = vpbroadcastd_avx512vl();
      fStack_45c = local_460;
      fStack_458 = local_460;
      fStack_454 = local_460;
      fStack_450 = local_460;
      fStack_44c = local_460;
      fStack_448 = local_460;
      fStack_444 = local_460;
      local_360 = uVar133;
      uStack_35c = uVar133;
      uStack_358 = uVar133;
      uStack_354 = uVar133;
      uStack_350 = uVar133;
      uStack_34c = uVar133;
      uStack_348 = uVar133;
      uStack_344 = uVar133;
      fStack_28c = fStack_290;
      fStack_288 = fStack_290;
      fStack_284 = fStack_290;
      for (lVar71 = 8; lVar71 < local_470; lVar71 = lVar71 + 8) {
        auVar93 = vpbroadcastd_avx512vl();
        auVar92 = vpor_avx2(auVar93,_DAT_01fb4ba0);
        uVar18 = vpcmpd_avx512vl(auVar92,local_3c0,1);
        auVar93 = *(undefined1 (*) [32])(bspline_basis0 + lVar71 * 4 + lVar72);
        auVar89 = *(undefined1 (*) [32])(lVar72 + 0x21fffac + lVar71 * 4);
        auVar90 = *(undefined1 (*) [32])(lVar72 + 0x2200430 + lVar71 * 4);
        auVar91 = *(undefined1 (*) [32])(lVar72 + 0x22008b4 + lVar71 * 4);
        local_4c0 = auVar184._0_32_;
        auVar94 = vmulps_avx512vl(local_4c0,auVar91);
        local_4e0 = auVar185._0_32_;
        auVar101 = vmulps_avx512vl(local_4e0,auVar91);
        auVar46._4_4_ = auVar91._4_4_ * (float)local_100._4_4_;
        auVar46._0_4_ = auVar91._0_4_ * (float)local_100._0_4_;
        auVar46._8_4_ = auVar91._8_4_ * fStack_f8;
        auVar46._12_4_ = auVar91._12_4_ * fStack_f4;
        auVar46._16_4_ = auVar91._16_4_ * fStack_f0;
        auVar46._20_4_ = auVar91._20_4_ * fStack_ec;
        auVar46._24_4_ = auVar91._24_4_ * fStack_e8;
        auVar46._28_4_ = auVar92._28_4_;
        auVar87 = auVar177._0_32_;
        auVar92 = vfmadd231ps_avx512vl(auVar94,auVar90,auVar87);
        local_500 = auVar183._0_32_;
        auVar94 = vfmadd231ps_avx512vl(auVar101,auVar90,local_500);
        auVar101 = vfmadd231ps_avx512vl(auVar46,auVar90,local_e0);
        auVar172 = auVar182._0_32_;
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar89,auVar172);
        auVar163 = auVar178._0_32_;
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,auVar163);
        auVar78 = vfmadd231ps_fma(auVar101,auVar89,local_c0);
        local_3e0 = auVar180._0_32_;
        auVar88 = vfmadd231ps_avx512vl(auVar92,auVar93,local_3e0);
        auVar171 = auVar181._0_32_;
        auVar85 = vfmadd231ps_avx512vl(auVar94,auVar93,auVar171);
        auVar92 = *(undefined1 (*) [32])(bspline_basis1 + lVar71 * 4 + lVar72);
        auVar94 = *(undefined1 (*) [32])(lVar72 + 0x22023cc + lVar71 * 4);
        auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar93,local_a0);
        auVar101 = *(undefined1 (*) [32])(lVar72 + 0x2202850 + lVar71 * 4);
        auVar100 = *(undefined1 (*) [32])(lVar72 + 0x2202cd4 + lVar71 * 4);
        auVar95 = vmulps_avx512vl(local_4c0,auVar100);
        auVar96 = vmulps_avx512vl(local_4e0,auVar100);
        auVar47._4_4_ = auVar100._4_4_ * (float)local_100._4_4_;
        auVar47._0_4_ = auVar100._0_4_ * (float)local_100._0_4_;
        auVar47._8_4_ = auVar100._8_4_ * fStack_f8;
        auVar47._12_4_ = auVar100._12_4_ * fStack_f4;
        auVar47._16_4_ = auVar100._16_4_ * fStack_f0;
        auVar47._20_4_ = auVar100._20_4_ * fStack_ec;
        auVar47._24_4_ = auVar100._24_4_ * fStack_e8;
        auVar47._28_4_ = uStack_e4;
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar101,auVar87);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar101,local_500);
        auVar86 = vfmadd231ps_avx512vl(auVar47,auVar101,local_e0);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar172);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,auVar163);
        auVar80 = vfmadd231ps_fma(auVar86,auVar94,local_c0);
        auVar86 = vfmadd231ps_avx512vl(auVar95,auVar92,local_3e0);
        auVar97 = vfmadd231ps_avx512vl(auVar96,auVar92,auVar171);
        auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar92,local_a0);
        auVar98 = vmaxps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar80));
        auVar95 = vsubps_avx(auVar86,auVar88);
        auVar96 = vsubps_avx(auVar97,auVar85);
        auVar99 = vmulps_avx512vl(auVar85,auVar95);
        auVar113 = vmulps_avx512vl(auVar88,auVar96);
        auVar99 = vsubps_avx512vl(auVar99,auVar113);
        auVar113 = vmulps_avx512vl(auVar96,auVar96);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar95,auVar95);
        auVar98 = vmulps_avx512vl(auVar98,auVar98);
        auVar98 = vmulps_avx512vl(auVar98,auVar113);
        auVar99 = vmulps_avx512vl(auVar99,auVar99);
        uVar142 = vcmpps_avx512vl(auVar99,auVar98,2);
        bVar73 = (byte)uVar18 & (byte)uVar142;
        if (bVar73 == 0) {
LAB_019eb94e:
          auVar178 = ZEXT3264(auVar163);
          auVar177 = ZEXT3264(auVar87);
        }
        else {
          auVar100 = vmulps_avx512vl(local_4a0,auVar100);
          auVar101 = vfmadd213ps_avx512vl(auVar101,local_160,auVar100);
          auVar94 = vfmadd213ps_avx512vl(auVar94,local_140,auVar101);
          auVar92 = vfmadd213ps_avx512vl(auVar92,local_120,auVar94);
          auVar91 = vmulps_avx512vl(local_4a0,auVar91);
          auVar90 = vfmadd213ps_avx512vl(auVar90,local_160,auVar91);
          auVar89 = vfmadd213ps_avx512vl(auVar89,local_140,auVar90);
          auVar94 = vfmadd213ps_avx512vl(auVar93,local_120,auVar89);
          auVar93 = *(undefined1 (*) [32])(lVar72 + 0x2200d38 + lVar71 * 4);
          auVar89 = *(undefined1 (*) [32])(lVar72 + 0x22011bc + lVar71 * 4);
          auVar90 = *(undefined1 (*) [32])(lVar72 + 0x2201640 + lVar71 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar72 + 0x2201ac4 + lVar71 * 4);
          auVar101 = vmulps_avx512vl(local_4c0,auVar91);
          auVar100 = vmulps_avx512vl(local_4e0,auVar91);
          auVar91 = vmulps_avx512vl(local_4a0,auVar91);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar90,auVar87);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar90,local_500);
          auVar90 = vfmadd231ps_avx512vl(auVar91,local_160,auVar90);
          auVar91 = vfmadd231ps_avx512vl(auVar101,auVar89,auVar172);
          auVar101 = vfmadd231ps_avx512vl(auVar100,auVar89,auVar163);
          auVar89 = vfmadd231ps_avx512vl(auVar90,local_140,auVar89);
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar93,local_3e0);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar93,auVar171);
          auVar100 = vfmadd231ps_avx512vl(auVar89,local_120,auVar93);
          auVar93 = *(undefined1 (*) [32])(lVar72 + 0x2203158 + lVar71 * 4);
          auVar89 = *(undefined1 (*) [32])(lVar72 + 0x2203a60 + lVar71 * 4);
          auVar90 = *(undefined1 (*) [32])(lVar72 + 0x2203ee4 + lVar71 * 4);
          auVar98 = vmulps_avx512vl(local_4c0,auVar90);
          auVar99 = vmulps_avx512vl(local_4e0,auVar90);
          auVar90 = vmulps_avx512vl(local_4a0,auVar90);
          auVar87 = vfmadd231ps_avx512vl(auVar98,auVar89,auVar87);
          auVar98 = vfmadd231ps_avx512vl(auVar99,auVar89,local_500);
          auVar90 = vfmadd231ps_avx512vl(auVar90,local_160,auVar89);
          auVar89 = *(undefined1 (*) [32])(lVar72 + 0x22035dc + lVar71 * 4);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar89,auVar172);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar89,auVar163);
          auVar89 = vfmadd231ps_avx512vl(auVar90,local_140,auVar89);
          auVar90 = vfmadd231ps_avx512vl(auVar87,auVar93,local_3e0);
          auVar87 = vfmadd231ps_avx512vl(auVar98,auVar93,auVar171);
          auVar89 = vfmadd231ps_avx512vl(auVar89,local_120,auVar93);
          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar91,auVar98);
          vandps_avx512vl(auVar101,auVar98);
          auVar93 = vmaxps_avx(auVar98,auVar98);
          vandps_avx512vl(auVar100,auVar98);
          auVar93 = vmaxps_avx(auVar93,auVar98);
          auVar64._4_4_ = fStack_45c;
          auVar64._0_4_ = local_460;
          auVar64._8_4_ = fStack_458;
          auVar64._12_4_ = fStack_454;
          auVar64._16_4_ = fStack_450;
          auVar64._20_4_ = fStack_44c;
          auVar64._24_4_ = fStack_448;
          auVar64._28_4_ = fStack_444;
          uVar74 = vcmpps_avx512vl(auVar93,auVar64,1);
          bVar12 = (bool)((byte)uVar74 & 1);
          auVar114._0_4_ = (float)((uint)bVar12 * auVar95._0_4_ | (uint)!bVar12 * auVar91._0_4_);
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar114._4_4_ = (float)((uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar91._4_4_);
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar114._8_4_ = (float)((uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar91._8_4_);
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar114._12_4_ = (float)((uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar91._12_4_);
          bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar114._16_4_ = (float)((uint)bVar12 * auVar95._16_4_ | (uint)!bVar12 * auVar91._16_4_);
          bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar114._20_4_ = (float)((uint)bVar12 * auVar95._20_4_ | (uint)!bVar12 * auVar91._20_4_);
          bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar114._24_4_ = (float)((uint)bVar12 * auVar95._24_4_ | (uint)!bVar12 * auVar91._24_4_);
          bVar12 = SUB81(uVar74 >> 7,0);
          auVar114._28_4_ = (uint)bVar12 * auVar95._28_4_ | (uint)!bVar12 * auVar91._28_4_;
          bVar12 = (bool)((byte)uVar74 & 1);
          auVar115._0_4_ = (float)((uint)bVar12 * auVar96._0_4_ | (uint)!bVar12 * auVar101._0_4_);
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar115._4_4_ = (float)((uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar101._4_4_);
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar115._8_4_ = (float)((uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar101._8_4_);
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar115._12_4_ = (float)((uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar101._12_4_)
          ;
          bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar115._16_4_ = (float)((uint)bVar12 * auVar96._16_4_ | (uint)!bVar12 * auVar101._16_4_)
          ;
          bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar115._20_4_ = (float)((uint)bVar12 * auVar96._20_4_ | (uint)!bVar12 * auVar101._20_4_)
          ;
          bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar115._24_4_ = (float)((uint)bVar12 * auVar96._24_4_ | (uint)!bVar12 * auVar101._24_4_)
          ;
          bVar12 = SUB81(uVar74 >> 7,0);
          auVar115._28_4_ = (uint)bVar12 * auVar96._28_4_ | (uint)!bVar12 * auVar101._28_4_;
          vandps_avx512vl(auVar90,auVar98);
          vandps_avx512vl(auVar87,auVar98);
          auVar93 = vmaxps_avx(auVar115,auVar115);
          vandps_avx512vl(auVar89,auVar98);
          auVar93 = vmaxps_avx(auVar93,auVar115);
          uVar74 = vcmpps_avx512vl(auVar93,auVar64,1);
          bVar12 = (bool)((byte)uVar74 & 1);
          auVar116._0_4_ = (uint)bVar12 * auVar95._0_4_ | (uint)!bVar12 * auVar90._0_4_;
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar116._4_4_ = (uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar90._4_4_;
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar116._8_4_ = (uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar90._8_4_;
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar116._12_4_ = (uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar90._12_4_;
          bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar116._16_4_ = (uint)bVar12 * auVar95._16_4_ | (uint)!bVar12 * auVar90._16_4_;
          bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar116._20_4_ = (uint)bVar12 * auVar95._20_4_ | (uint)!bVar12 * auVar90._20_4_;
          bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar116._24_4_ = (uint)bVar12 * auVar95._24_4_ | (uint)!bVar12 * auVar90._24_4_;
          bVar12 = SUB81(uVar74 >> 7,0);
          auVar116._28_4_ = (uint)bVar12 * auVar95._28_4_ | (uint)!bVar12 * auVar90._28_4_;
          bVar12 = (bool)((byte)uVar74 & 1);
          auVar117._0_4_ = (float)((uint)bVar12 * auVar96._0_4_ | (uint)!bVar12 * auVar87._0_4_);
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar117._4_4_ = (float)((uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar87._4_4_);
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar117._8_4_ = (float)((uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar87._8_4_);
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar117._12_4_ = (float)((uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar87._12_4_);
          bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar117._16_4_ = (float)((uint)bVar12 * auVar96._16_4_ | (uint)!bVar12 * auVar87._16_4_);
          bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar117._20_4_ = (float)((uint)bVar12 * auVar96._20_4_ | (uint)!bVar12 * auVar87._20_4_);
          bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar117._24_4_ = (float)((uint)bVar12 * auVar96._24_4_ | (uint)!bVar12 * auVar87._24_4_);
          bVar12 = SUB81(uVar74 >> 7,0);
          auVar117._28_4_ = (uint)bVar12 * auVar96._28_4_ | (uint)!bVar12 * auVar87._28_4_;
          auVar167._8_4_ = 0x80000000;
          auVar167._0_8_ = 0x8000000080000000;
          auVar167._12_4_ = 0x80000000;
          auVar167._16_4_ = 0x80000000;
          auVar167._20_4_ = 0x80000000;
          auVar167._24_4_ = 0x80000000;
          auVar167._28_4_ = 0x80000000;
          auVar93 = vxorps_avx512vl(auVar116,auVar167);
          auVar98 = auVar179._0_32_;
          auVar89 = vfmadd213ps_avx512vl(auVar114,auVar114,auVar98);
          auVar77 = vfmadd231ps_fma(auVar89,auVar115,auVar115);
          auVar89 = vrsqrt14ps_avx512vl(ZEXT1632(auVar77));
          auVar176._8_4_ = 0xbf000000;
          auVar176._0_8_ = 0xbf000000bf000000;
          auVar176._12_4_ = 0xbf000000;
          auVar176._16_4_ = 0xbf000000;
          auVar176._20_4_ = 0xbf000000;
          auVar176._24_4_ = 0xbf000000;
          auVar176._28_4_ = 0xbf000000;
          fVar147 = auVar89._0_4_;
          fVar132 = auVar89._4_4_;
          fVar140 = auVar89._8_4_;
          fVar141 = auVar89._12_4_;
          fVar161 = auVar89._16_4_;
          fVar160 = auVar89._20_4_;
          fVar162 = auVar89._24_4_;
          auVar48._4_4_ = fVar132 * fVar132 * fVar132 * auVar77._4_4_ * -0.5;
          auVar48._0_4_ = fVar147 * fVar147 * fVar147 * auVar77._0_4_ * -0.5;
          auVar48._8_4_ = fVar140 * fVar140 * fVar140 * auVar77._8_4_ * -0.5;
          auVar48._12_4_ = fVar141 * fVar141 * fVar141 * auVar77._12_4_ * -0.5;
          auVar48._16_4_ = fVar161 * fVar161 * fVar161 * -0.0;
          auVar48._20_4_ = fVar160 * fVar160 * fVar160 * -0.0;
          auVar48._24_4_ = fVar162 * fVar162 * fVar162 * -0.0;
          auVar48._28_4_ = auVar115._28_4_;
          auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar89 = vfmadd231ps_avx512vl(auVar48,auVar90,auVar89);
          auVar49._4_4_ = auVar115._4_4_ * auVar89._4_4_;
          auVar49._0_4_ = auVar115._0_4_ * auVar89._0_4_;
          auVar49._8_4_ = auVar115._8_4_ * auVar89._8_4_;
          auVar49._12_4_ = auVar115._12_4_ * auVar89._12_4_;
          auVar49._16_4_ = auVar115._16_4_ * auVar89._16_4_;
          auVar49._20_4_ = auVar115._20_4_ * auVar89._20_4_;
          auVar49._24_4_ = auVar115._24_4_ * auVar89._24_4_;
          auVar49._28_4_ = 0;
          auVar50._4_4_ = auVar89._4_4_ * -auVar114._4_4_;
          auVar50._0_4_ = auVar89._0_4_ * -auVar114._0_4_;
          auVar50._8_4_ = auVar89._8_4_ * -auVar114._8_4_;
          auVar50._12_4_ = auVar89._12_4_ * -auVar114._12_4_;
          auVar50._16_4_ = auVar89._16_4_ * -auVar114._16_4_;
          auVar50._20_4_ = auVar89._20_4_ * -auVar114._20_4_;
          auVar50._24_4_ = auVar89._24_4_ * -auVar114._24_4_;
          auVar50._28_4_ = auVar115._28_4_;
          auVar91 = vmulps_avx512vl(auVar89,auVar98);
          auVar89 = vfmadd213ps_avx512vl(auVar116,auVar116,auVar98);
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar117,auVar117);
          auVar101 = vrsqrt14ps_avx512vl(auVar89);
          auVar89 = vmulps_avx512vl(auVar89,auVar176);
          fVar147 = auVar101._0_4_;
          fVar132 = auVar101._4_4_;
          fVar140 = auVar101._8_4_;
          fVar141 = auVar101._12_4_;
          fVar161 = auVar101._16_4_;
          fVar160 = auVar101._20_4_;
          fVar162 = auVar101._24_4_;
          auVar51._4_4_ = fVar132 * fVar132 * fVar132 * auVar89._4_4_;
          auVar51._0_4_ = fVar147 * fVar147 * fVar147 * auVar89._0_4_;
          auVar51._8_4_ = fVar140 * fVar140 * fVar140 * auVar89._8_4_;
          auVar51._12_4_ = fVar141 * fVar141 * fVar141 * auVar89._12_4_;
          auVar51._16_4_ = fVar161 * fVar161 * fVar161 * auVar89._16_4_;
          auVar51._20_4_ = fVar160 * fVar160 * fVar160 * auVar89._20_4_;
          auVar51._24_4_ = fVar162 * fVar162 * fVar162 * auVar89._24_4_;
          auVar51._28_4_ = auVar89._28_4_;
          auVar89 = vfmadd231ps_avx512vl(auVar51,auVar90,auVar101);
          auVar52._4_4_ = auVar117._4_4_ * auVar89._4_4_;
          auVar52._0_4_ = auVar117._0_4_ * auVar89._0_4_;
          auVar52._8_4_ = auVar117._8_4_ * auVar89._8_4_;
          auVar52._12_4_ = auVar117._12_4_ * auVar89._12_4_;
          auVar52._16_4_ = auVar117._16_4_ * auVar89._16_4_;
          auVar52._20_4_ = auVar117._20_4_ * auVar89._20_4_;
          auVar52._24_4_ = auVar117._24_4_ * auVar89._24_4_;
          auVar52._28_4_ = auVar101._28_4_;
          auVar53._4_4_ = auVar89._4_4_ * auVar93._4_4_;
          auVar53._0_4_ = auVar89._0_4_ * auVar93._0_4_;
          auVar53._8_4_ = auVar89._8_4_ * auVar93._8_4_;
          auVar53._12_4_ = auVar89._12_4_ * auVar93._12_4_;
          auVar53._16_4_ = auVar89._16_4_ * auVar93._16_4_;
          auVar53._20_4_ = auVar89._20_4_ * auVar93._20_4_;
          auVar53._24_4_ = auVar89._24_4_ * auVar93._24_4_;
          auVar53._28_4_ = auVar93._28_4_;
          auVar93 = vmulps_avx512vl(auVar89,auVar98);
          auVar77 = vfmadd213ps_fma(auVar49,ZEXT1632(auVar78),auVar88);
          auVar89 = ZEXT1632(auVar78);
          auVar76 = vfmadd213ps_fma(auVar50,auVar89,auVar85);
          auVar90 = vfmadd213ps_avx512vl(auVar91,auVar89,auVar94);
          auVar101 = vfmadd213ps_avx512vl(auVar52,ZEXT1632(auVar80),auVar86);
          auVar79 = vfnmadd213ps_fma(auVar49,auVar89,auVar88);
          auVar100 = ZEXT1632(auVar80);
          auVar6 = vfmadd213ps_fma(auVar53,auVar100,auVar97);
          auVar81 = vfnmadd213ps_fma(auVar50,auVar89,auVar85);
          auVar7 = vfmadd213ps_fma(auVar93,auVar100,auVar92);
          auVar85 = ZEXT1632(auVar78);
          auVar149 = vfnmadd231ps_fma(auVar94,auVar85,auVar91);
          auVar144 = vfnmadd213ps_fma(auVar52,auVar100,auVar86);
          auVar148 = vfnmadd213ps_fma(auVar53,auVar100,auVar97);
          auVar82 = vfnmadd231ps_fma(auVar92,ZEXT1632(auVar80),auVar93);
          auVar92 = vsubps_avx512vl(auVar101,ZEXT1632(auVar79));
          auVar93 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar81));
          auVar89 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar149));
          auVar54._4_4_ = auVar93._4_4_ * auVar149._4_4_;
          auVar54._0_4_ = auVar93._0_4_ * auVar149._0_4_;
          auVar54._8_4_ = auVar93._8_4_ * auVar149._8_4_;
          auVar54._12_4_ = auVar93._12_4_ * auVar149._12_4_;
          auVar54._16_4_ = auVar93._16_4_ * 0.0;
          auVar54._20_4_ = auVar93._20_4_ * 0.0;
          auVar54._24_4_ = auVar93._24_4_ * 0.0;
          auVar54._28_4_ = auVar91._28_4_;
          auVar78 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar81),auVar89);
          auVar55._4_4_ = auVar89._4_4_ * auVar79._4_4_;
          auVar55._0_4_ = auVar89._0_4_ * auVar79._0_4_;
          auVar55._8_4_ = auVar89._8_4_ * auVar79._8_4_;
          auVar55._12_4_ = auVar89._12_4_ * auVar79._12_4_;
          auVar55._16_4_ = auVar89._16_4_ * 0.0;
          auVar55._20_4_ = auVar89._20_4_ * 0.0;
          auVar55._24_4_ = auVar89._24_4_ * 0.0;
          auVar55._28_4_ = auVar89._28_4_;
          auVar8 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar149),auVar92);
          auVar56._4_4_ = auVar81._4_4_ * auVar92._4_4_;
          auVar56._0_4_ = auVar81._0_4_ * auVar92._0_4_;
          auVar56._8_4_ = auVar81._8_4_ * auVar92._8_4_;
          auVar56._12_4_ = auVar81._12_4_ * auVar92._12_4_;
          auVar56._16_4_ = auVar92._16_4_ * 0.0;
          auVar56._20_4_ = auVar92._20_4_ * 0.0;
          auVar56._24_4_ = auVar92._24_4_ * 0.0;
          auVar56._28_4_ = auVar92._28_4_;
          auVar9 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar79),auVar93);
          auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar98,ZEXT1632(auVar8));
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,ZEXT1632(auVar78));
          uVar74 = vcmpps_avx512vl(auVar93,auVar98,2);
          bVar67 = (byte)uVar74;
          fVar124 = (float)((uint)(bVar67 & 1) * auVar77._0_4_ |
                           (uint)!(bool)(bVar67 & 1) * auVar144._0_4_);
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          fVar126 = (float)((uint)bVar12 * auVar77._4_4_ | (uint)!bVar12 * auVar144._4_4_);
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          fVar128 = (float)((uint)bVar12 * auVar77._8_4_ | (uint)!bVar12 * auVar144._8_4_);
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          fVar130 = (float)((uint)bVar12 * auVar77._12_4_ | (uint)!bVar12 * auVar144._12_4_);
          auVar100 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar128,CONCAT44(fVar126,fVar124))));
          fVar125 = (float)((uint)(bVar67 & 1) * auVar76._0_4_ |
                           (uint)!(bool)(bVar67 & 1) * auVar148._0_4_);
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          fVar127 = (float)((uint)bVar12 * auVar76._4_4_ | (uint)!bVar12 * auVar148._4_4_);
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          fVar129 = (float)((uint)bVar12 * auVar76._8_4_ | (uint)!bVar12 * auVar148._8_4_);
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          fVar131 = (float)((uint)bVar12 * auVar76._12_4_ | (uint)!bVar12 * auVar148._12_4_);
          auVar95 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar129,CONCAT44(fVar127,fVar125))));
          auVar118._0_4_ =
               (float)((uint)(bVar67 & 1) * auVar90._0_4_ |
                      (uint)!(bool)(bVar67 & 1) * auVar82._0_4_);
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar12 * auVar90._4_4_ | (uint)!bVar12 * auVar82._4_4_);
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar12 * auVar90._8_4_ | (uint)!bVar12 * auVar82._8_4_);
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar12 * auVar90._12_4_ | (uint)!bVar12 * auVar82._12_4_);
          fVar132 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar90._16_4_);
          auVar118._16_4_ = fVar132;
          fVar147 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar90._20_4_);
          auVar118._20_4_ = fVar147;
          fVar140 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar90._24_4_);
          auVar118._24_4_ = fVar140;
          iVar2 = (uint)(byte)(uVar74 >> 7) * auVar90._28_4_;
          auVar118._28_4_ = iVar2;
          auVar93 = vblendmps_avx512vl(ZEXT1632(auVar79),auVar101);
          auVar119._0_4_ =
               (uint)(bVar67 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar78._0_4_;
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar119._4_4_ = (uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar78._4_4_;
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar119._8_4_ = (uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar78._8_4_;
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar119._12_4_ = (uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar78._12_4_;
          auVar119._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * auVar93._16_4_;
          auVar119._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * auVar93._20_4_;
          auVar119._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * auVar93._24_4_;
          auVar119._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar93._28_4_;
          auVar93 = vblendmps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar6));
          auVar120._0_4_ =
               (float)((uint)(bVar67 & 1) * auVar93._0_4_ |
                      (uint)!(bool)(bVar67 & 1) * auVar77._0_4_);
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar77._4_4_);
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar77._8_4_);
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar77._12_4_);
          fVar141 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar93._16_4_);
          auVar120._16_4_ = fVar141;
          fVar161 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar93._20_4_);
          auVar120._20_4_ = fVar161;
          fVar160 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar93._24_4_);
          auVar120._24_4_ = fVar160;
          auVar120._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar93._28_4_;
          auVar93 = vblendmps_avx512vl(ZEXT1632(auVar149),ZEXT1632(auVar7));
          auVar121._0_4_ =
               (float)((uint)(bVar67 & 1) * auVar93._0_4_ |
                      (uint)!(bool)(bVar67 & 1) * auVar76._0_4_);
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar76._4_4_);
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar76._8_4_);
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar76._12_4_);
          fVar162 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar93._16_4_);
          auVar121._16_4_ = fVar162;
          fVar75 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar93._20_4_);
          auVar121._20_4_ = fVar75;
          fVar146 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar93._24_4_);
          auVar121._24_4_ = fVar146;
          iVar3 = (uint)(byte)(uVar74 >> 7) * auVar93._28_4_;
          auVar121._28_4_ = iVar3;
          auVar122._0_4_ =
               (uint)(bVar67 & 1) * (int)auVar79._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar101._0_4_;
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar12 * (int)auVar79._4_4_ | (uint)!bVar12 * auVar101._4_4_;
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar12 * (int)auVar79._8_4_ | (uint)!bVar12 * auVar101._8_4_;
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar12 * (int)auVar79._12_4_ | (uint)!bVar12 * auVar101._12_4_;
          auVar122._16_4_ = (uint)!(bool)((byte)(uVar74 >> 4) & 1) * auVar101._16_4_;
          auVar122._20_4_ = (uint)!(bool)((byte)(uVar74 >> 5) & 1) * auVar101._20_4_;
          auVar122._24_4_ = (uint)!(bool)((byte)(uVar74 >> 6) & 1) * auVar101._24_4_;
          auVar122._28_4_ = (uint)!SUB81(uVar74 >> 7,0) * auVar101._28_4_;
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar74 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar74 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar101 = vsubps_avx512vl(auVar122,auVar100);
          auVar89 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar81._12_4_ |
                                                  (uint)!bVar16 * auVar6._12_4_,
                                                  CONCAT48((uint)bVar15 * (int)auVar81._8_4_ |
                                                           (uint)!bVar15 * auVar6._8_4_,
                                                           CONCAT44((uint)bVar12 *
                                                                    (int)auVar81._4_4_ |
                                                                    (uint)!bVar12 * auVar6._4_4_,
                                                                    (uint)(bVar67 & 1) *
                                                                    (int)auVar81._0_4_ |
                                                                    (uint)!(bool)(bVar67 & 1) *
                                                                    auVar6._0_4_)))),auVar95);
          auVar90 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar149._12_4_ |
                                                  (uint)!bVar17 * auVar7._12_4_,
                                                  CONCAT48((uint)bVar14 * (int)auVar149._8_4_ |
                                                           (uint)!bVar14 * auVar7._8_4_,
                                                           CONCAT44((uint)bVar13 *
                                                                    (int)auVar149._4_4_ |
                                                                    (uint)!bVar13 * auVar7._4_4_,
                                                                    (uint)(bVar67 & 1) *
                                                                    (int)auVar149._0_4_ |
                                                                    (uint)!(bool)(bVar67 & 1) *
                                                                    auVar7._0_4_)))),auVar118);
          auVar91 = vsubps_avx(auVar100,auVar119);
          auVar92 = vsubps_avx(auVar95,auVar120);
          auVar94 = vsubps_avx(auVar118,auVar121);
          auVar57._4_4_ = auVar90._4_4_ * fVar126;
          auVar57._0_4_ = auVar90._0_4_ * fVar124;
          auVar57._8_4_ = auVar90._8_4_ * fVar128;
          auVar57._12_4_ = auVar90._12_4_ * fVar130;
          auVar57._16_4_ = auVar90._16_4_ * 0.0;
          auVar57._20_4_ = auVar90._20_4_ * 0.0;
          auVar57._24_4_ = auVar90._24_4_ * 0.0;
          auVar57._28_4_ = 0;
          auVar78 = vfmsub231ps_fma(auVar57,auVar118,auVar101);
          auVar151._0_4_ = fVar125 * auVar101._0_4_;
          auVar151._4_4_ = fVar127 * auVar101._4_4_;
          auVar151._8_4_ = fVar129 * auVar101._8_4_;
          auVar151._12_4_ = fVar131 * auVar101._12_4_;
          auVar151._16_4_ = auVar101._16_4_ * 0.0;
          auVar151._20_4_ = auVar101._20_4_ * 0.0;
          auVar151._24_4_ = auVar101._24_4_ * 0.0;
          auVar151._28_4_ = 0;
          auVar77 = vfmsub231ps_fma(auVar151,auVar100,auVar89);
          auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar98,ZEXT1632(auVar78));
          auVar158._0_4_ = auVar89._0_4_ * auVar118._0_4_;
          auVar158._4_4_ = auVar89._4_4_ * auVar118._4_4_;
          auVar158._8_4_ = auVar89._8_4_ * auVar118._8_4_;
          auVar158._12_4_ = auVar89._12_4_ * auVar118._12_4_;
          auVar158._16_4_ = auVar89._16_4_ * fVar132;
          auVar158._20_4_ = auVar89._20_4_ * fVar147;
          auVar158._24_4_ = auVar89._24_4_ * fVar140;
          auVar158._28_4_ = 0;
          auVar78 = vfmsub231ps_fma(auVar158,auVar95,auVar90);
          auVar96 = vfmadd231ps_avx512vl(auVar93,auVar98,ZEXT1632(auVar78));
          auVar93 = vmulps_avx512vl(auVar94,auVar119);
          auVar93 = vfmsub231ps_avx512vl(auVar93,auVar91,auVar121);
          auVar58._4_4_ = auVar92._4_4_ * auVar121._4_4_;
          auVar58._0_4_ = auVar92._0_4_ * auVar121._0_4_;
          auVar58._8_4_ = auVar92._8_4_ * auVar121._8_4_;
          auVar58._12_4_ = auVar92._12_4_ * auVar121._12_4_;
          auVar58._16_4_ = auVar92._16_4_ * fVar162;
          auVar58._20_4_ = auVar92._20_4_ * fVar75;
          auVar58._24_4_ = auVar92._24_4_ * fVar146;
          auVar58._28_4_ = iVar3;
          auVar78 = vfmsub231ps_fma(auVar58,auVar120,auVar94);
          auVar159._0_4_ = auVar120._0_4_ * auVar91._0_4_;
          auVar159._4_4_ = auVar120._4_4_ * auVar91._4_4_;
          auVar159._8_4_ = auVar120._8_4_ * auVar91._8_4_;
          auVar159._12_4_ = auVar120._12_4_ * auVar91._12_4_;
          auVar159._16_4_ = fVar141 * auVar91._16_4_;
          auVar159._20_4_ = fVar161 * auVar91._20_4_;
          auVar159._24_4_ = fVar160 * auVar91._24_4_;
          auVar159._28_4_ = 0;
          auVar77 = vfmsub231ps_fma(auVar159,auVar92,auVar119);
          auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar98,auVar93);
          auVar88 = vfmadd231ps_avx512vl(auVar93,auVar98,ZEXT1632(auVar78));
          auVar93 = vmaxps_avx(auVar96,auVar88);
          uVar142 = vcmpps_avx512vl(auVar93,auVar98,2);
          bVar73 = bVar73 & (byte)uVar142;
          auVar178 = ZEXT3264(auVar163);
          auVar87 = local_560;
          if (bVar73 == 0) goto LAB_019eb94e;
          auVar59._4_4_ = auVar94._4_4_ * auVar89._4_4_;
          auVar59._0_4_ = auVar94._0_4_ * auVar89._0_4_;
          auVar59._8_4_ = auVar94._8_4_ * auVar89._8_4_;
          auVar59._12_4_ = auVar94._12_4_ * auVar89._12_4_;
          auVar59._16_4_ = auVar94._16_4_ * auVar89._16_4_;
          auVar59._20_4_ = auVar94._20_4_ * auVar89._20_4_;
          auVar59._24_4_ = auVar94._24_4_ * auVar89._24_4_;
          auVar59._28_4_ = auVar93._28_4_;
          auVar76 = vfmsub231ps_fma(auVar59,auVar92,auVar90);
          auVar60._4_4_ = auVar90._4_4_ * auVar91._4_4_;
          auVar60._0_4_ = auVar90._0_4_ * auVar91._0_4_;
          auVar60._8_4_ = auVar90._8_4_ * auVar91._8_4_;
          auVar60._12_4_ = auVar90._12_4_ * auVar91._12_4_;
          auVar60._16_4_ = auVar90._16_4_ * auVar91._16_4_;
          auVar60._20_4_ = auVar90._20_4_ * auVar91._20_4_;
          auVar60._24_4_ = auVar90._24_4_ * auVar91._24_4_;
          auVar60._28_4_ = auVar90._28_4_;
          auVar77 = vfmsub231ps_fma(auVar60,auVar101,auVar94);
          auVar61._4_4_ = auVar92._4_4_ * auVar101._4_4_;
          auVar61._0_4_ = auVar92._0_4_ * auVar101._0_4_;
          auVar61._8_4_ = auVar92._8_4_ * auVar101._8_4_;
          auVar61._12_4_ = auVar92._12_4_ * auVar101._12_4_;
          auVar61._16_4_ = auVar92._16_4_ * auVar101._16_4_;
          auVar61._20_4_ = auVar92._20_4_ * auVar101._20_4_;
          auVar61._24_4_ = auVar92._24_4_ * auVar101._24_4_;
          auVar61._28_4_ = auVar92._28_4_;
          auVar6 = vfmsub231ps_fma(auVar61,auVar91,auVar89);
          auVar78 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar77),ZEXT1632(auVar6));
          auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar76),auVar98);
          auVar89 = vrcp14ps_avx512vl(auVar93);
          auVar91 = auVar186._0_32_;
          auVar90 = vfnmadd213ps_avx512vl(auVar89,auVar93,auVar91);
          auVar78 = vfmadd132ps_fma(auVar90,auVar89,auVar89);
          auVar62._4_4_ = auVar6._4_4_ * auVar118._4_4_;
          auVar62._0_4_ = auVar6._0_4_ * auVar118._0_4_;
          auVar62._8_4_ = auVar6._8_4_ * auVar118._8_4_;
          auVar62._12_4_ = auVar6._12_4_ * auVar118._12_4_;
          auVar62._16_4_ = fVar132 * 0.0;
          auVar62._20_4_ = fVar147 * 0.0;
          auVar62._24_4_ = fVar140 * 0.0;
          auVar62._28_4_ = iVar2;
          auVar77 = vfmadd231ps_fma(auVar62,auVar95,ZEXT1632(auVar77));
          auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar100,ZEXT1632(auVar76));
          fVar147 = auVar78._0_4_;
          fVar132 = auVar78._4_4_;
          fVar140 = auVar78._8_4_;
          fVar141 = auVar78._12_4_;
          local_240 = ZEXT1632(CONCAT412(auVar77._12_4_ * fVar141,
                                         CONCAT48(auVar77._8_4_ * fVar140,
                                                  CONCAT44(auVar77._4_4_ * fVar132,
                                                           auVar77._0_4_ * fVar147))));
          auVar65._4_4_ = uStack_35c;
          auVar65._0_4_ = local_360;
          auVar65._8_4_ = uStack_358;
          auVar65._12_4_ = uStack_354;
          auVar65._16_4_ = uStack_350;
          auVar65._20_4_ = uStack_34c;
          auVar65._24_4_ = uStack_348;
          auVar65._28_4_ = uStack_344;
          uVar142 = vcmpps_avx512vl(local_240,auVar65,0xd);
          uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar27._4_4_ = uVar133;
          auVar27._0_4_ = uVar133;
          auVar27._8_4_ = uVar133;
          auVar27._12_4_ = uVar133;
          auVar27._16_4_ = uVar133;
          auVar27._20_4_ = uVar133;
          auVar27._24_4_ = uVar133;
          auVar27._28_4_ = uVar133;
          uVar18 = vcmpps_avx512vl(local_240,auVar27,2);
          bVar73 = (byte)uVar142 & (byte)uVar18 & bVar73;
          if (bVar73 == 0) goto LAB_019eb94e;
          uVar142 = vcmpps_avx512vl(auVar93,auVar98,4);
          bVar73 = bVar73 & (byte)uVar142;
          auVar173 = ZEXT1664(local_5c0);
          auVar177 = ZEXT3264(local_560);
          if (bVar73 != 0) {
            fVar161 = auVar96._0_4_ * fVar147;
            fVar160 = auVar96._4_4_ * fVar132;
            auVar63._4_4_ = fVar160;
            auVar63._0_4_ = fVar161;
            fVar162 = auVar96._8_4_ * fVar140;
            auVar63._8_4_ = fVar162;
            fVar75 = auVar96._12_4_ * fVar141;
            auVar63._12_4_ = fVar75;
            fVar146 = auVar96._16_4_ * 0.0;
            auVar63._16_4_ = fVar146;
            fVar124 = auVar96._20_4_ * 0.0;
            auVar63._20_4_ = fVar124;
            fVar125 = auVar96._24_4_ * 0.0;
            auVar63._24_4_ = fVar125;
            auVar63._28_4_ = auVar93._28_4_;
            auVar89 = vsubps_avx512vl(auVar91,auVar63);
            local_280._0_4_ =
                 (float)((uint)(bVar67 & 1) * (int)fVar161 |
                        (uint)!(bool)(bVar67 & 1) * auVar89._0_4_);
            bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
            local_280._4_4_ = (float)((uint)bVar12 * (int)fVar160 | (uint)!bVar12 * auVar89._4_4_);
            bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
            local_280._8_4_ = (float)((uint)bVar12 * (int)fVar162 | (uint)!bVar12 * auVar89._8_4_);
            bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
            local_280._12_4_ = (float)((uint)bVar12 * (int)fVar75 | (uint)!bVar12 * auVar89._12_4_);
            bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
            local_280._16_4_ = (float)((uint)bVar12 * (int)fVar146 | (uint)!bVar12 * auVar89._16_4_)
            ;
            bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
            local_280._20_4_ = (float)((uint)bVar12 * (int)fVar124 | (uint)!bVar12 * auVar89._20_4_)
            ;
            bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
            local_280._24_4_ = (float)((uint)bVar12 * (int)fVar125 | (uint)!bVar12 * auVar89._24_4_)
            ;
            bVar12 = SUB81(uVar74 >> 7,0);
            local_280._28_4_ =
                 (float)((uint)bVar12 * auVar93._28_4_ | (uint)!bVar12 * auVar89._28_4_);
            auVar93 = vsubps_avx(ZEXT1632(auVar80),auVar85);
            auVar78 = vfmadd213ps_fma(auVar93,local_280,auVar85);
            uVar133 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
            auVar28._4_4_ = uVar133;
            auVar28._0_4_ = uVar133;
            auVar28._8_4_ = uVar133;
            auVar28._12_4_ = uVar133;
            auVar28._16_4_ = uVar133;
            auVar28._20_4_ = uVar133;
            auVar28._24_4_ = uVar133;
            auVar28._28_4_ = uVar133;
            auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar78._12_4_ + auVar78._12_4_,
                                                         CONCAT48(auVar78._8_4_ + auVar78._8_4_,
                                                                  CONCAT44(auVar78._4_4_ +
                                                                           auVar78._4_4_,
                                                                           auVar78._0_4_ +
                                                                           auVar78._0_4_)))),auVar28
                                     );
            uVar142 = vcmpps_avx512vl(local_240,auVar93,6);
            if (((byte)uVar142 & bVar73) != 0) {
              auVar143._0_4_ = auVar88._0_4_ * fVar147;
              auVar143._4_4_ = auVar88._4_4_ * fVar132;
              auVar143._8_4_ = auVar88._8_4_ * fVar140;
              auVar143._12_4_ = auVar88._12_4_ * fVar141;
              auVar143._16_4_ = auVar88._16_4_ * 0.0;
              auVar143._20_4_ = auVar88._20_4_ * 0.0;
              auVar143._24_4_ = auVar88._24_4_ * 0.0;
              auVar143._28_4_ = 0;
              auVar93 = vsubps_avx512vl(auVar91,auVar143);
              auVar123._0_4_ =
                   (uint)(bVar67 & 1) * (int)auVar143._0_4_ |
                   (uint)!(bool)(bVar67 & 1) * auVar93._0_4_;
              bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
              auVar123._4_4_ = (uint)bVar12 * (int)auVar143._4_4_ | (uint)!bVar12 * auVar93._4_4_;
              bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
              auVar123._8_4_ = (uint)bVar12 * (int)auVar143._8_4_ | (uint)!bVar12 * auVar93._8_4_;
              bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
              auVar123._12_4_ = (uint)bVar12 * (int)auVar143._12_4_ | (uint)!bVar12 * auVar93._12_4_
              ;
              bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
              auVar123._16_4_ = (uint)bVar12 * (int)auVar143._16_4_ | (uint)!bVar12 * auVar93._16_4_
              ;
              bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
              auVar123._20_4_ = (uint)bVar12 * (int)auVar143._20_4_ | (uint)!bVar12 * auVar93._20_4_
              ;
              bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
              auVar123._24_4_ = (uint)bVar12 * (int)auVar143._24_4_ | (uint)!bVar12 * auVar93._24_4_
              ;
              auVar123._28_4_ = (uint)!SUB81(uVar74 >> 7,0) * auVar93._28_4_;
              auVar29._8_4_ = 0x40000000;
              auVar29._0_8_ = 0x4000000040000000;
              auVar29._12_4_ = 0x40000000;
              auVar29._16_4_ = 0x40000000;
              auVar29._20_4_ = 0x40000000;
              auVar29._24_4_ = 0x40000000;
              auVar29._28_4_ = 0x40000000;
              local_260 = vfmsub132ps_avx512vl(auVar123,auVar91,auVar29);
              local_220 = (undefined4)lVar71;
              local_210 = local_5c0;
              local_200 = local_510._0_8_;
              uStack_1f8 = local_510._8_8_;
              local_1f0 = local_520._0_8_;
              uStack_1e8 = local_520._8_8_;
              pGVar10 = (context->scene->geometries).items[local_5c8].ptr;
              if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                bVar67 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar67 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar78 = vcvtsi2ss_avx512f(auVar179._0_16_,local_220);
                fVar147 = auVar78._0_4_;
                local_1c0[0] = (fVar147 + local_280._0_4_ + 0.0) * (float)local_2a0._0_4_;
                local_1c0[1] = (fVar147 + local_280._4_4_ + 1.0) * (float)local_2a0._4_4_;
                local_1c0[2] = (fVar147 + local_280._8_4_ + 2.0) * fStack_298;
                local_1c0[3] = (fVar147 + local_280._12_4_ + 3.0) * fStack_294;
                fStack_1b0 = (fVar147 + local_280._16_4_ + 4.0) * fStack_290;
                fStack_1ac = (fVar147 + local_280._20_4_ + 5.0) * fStack_28c;
                fStack_1a8 = (fVar147 + local_280._24_4_ + 6.0) * fStack_288;
                fStack_1a4 = fVar147 + local_280._28_4_ + 7.0;
                local_1a0 = local_260;
                local_180 = local_240;
                uVar74 = 0;
                uVar69 = (ulong)((byte)uVar142 & bVar73);
                for (uVar20 = uVar69; local_5a0 = pGVar10, local_21c = iVar19, (uVar20 & 1) == 0;
                    uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                  uVar74 = uVar74 + 1;
                }
                while (auVar78 = auVar179._0_16_, uVar69 != 0) {
                  uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
                  fVar147 = local_1c0[uVar74];
                  local_300._4_4_ = fVar147;
                  local_300._0_4_ = fVar147;
                  local_300._8_4_ = fVar147;
                  local_300._12_4_ = fVar147;
                  local_2f0 = *(undefined4 *)(local_1a0 + uVar74 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar74 * 4);
                  local_590.context = context->user;
                  fVar132 = 1.0 - fVar147;
                  auVar22._8_4_ = 0x80000000;
                  auVar22._0_8_ = 0x8000000080000000;
                  auVar22._12_4_ = 0x80000000;
                  auVar77 = vxorps_avx512vl(ZEXT416((uint)fVar132),auVar22);
                  auVar78 = ZEXT416((uint)(fVar147 * fVar132 * 4.0));
                  auVar80 = vfnmsub213ss_fma(local_300,local_300,auVar78);
                  auVar78 = vfmadd213ss_fma(ZEXT416((uint)fVar132),ZEXT416((uint)fVar132),auVar78);
                  fVar132 = fVar132 * auVar77._0_4_ * 0.5;
                  fVar140 = auVar80._0_4_ * 0.5;
                  fVar141 = auVar78._0_4_ * 0.5;
                  fVar147 = fVar147 * fVar147 * 0.5;
                  auVar154._0_4_ = fVar147 * (float)local_370._0_4_;
                  auVar154._4_4_ = fVar147 * (float)local_370._4_4_;
                  auVar154._8_4_ = fVar147 * fStack_368;
                  auVar154._12_4_ = fVar147 * fStack_364;
                  auVar137._4_4_ = fVar141;
                  auVar137._0_4_ = fVar141;
                  auVar137._8_4_ = fVar141;
                  auVar137._12_4_ = fVar141;
                  auVar78 = vfmadd132ps_fma(auVar137,auVar154,local_520);
                  auVar155._4_4_ = fVar140;
                  auVar155._0_4_ = fVar140;
                  auVar155._8_4_ = fVar140;
                  auVar155._12_4_ = fVar140;
                  auVar78 = vfmadd132ps_fma(auVar155,auVar78,local_510);
                  auVar138._4_4_ = fVar132;
                  auVar138._0_4_ = fVar132;
                  auVar138._8_4_ = fVar132;
                  auVar138._12_4_ = fVar132;
                  auVar78 = vfmadd213ps_fma(auVar138,auVar173._0_16_,auVar78);
                  uVar134 = auVar78._0_4_;
                  local_330._4_4_ = uVar134;
                  local_330._0_4_ = uVar134;
                  local_330._8_4_ = uVar134;
                  local_330._12_4_ = uVar134;
                  local_320 = vshufps_avx(auVar78,auVar78,0x55);
                  local_310 = vshufps_avx(auVar78,auVar78,0xaa);
                  local_2e0 = local_380._0_8_;
                  uStack_2d8 = local_380._8_8_;
                  local_2d0 = local_530;
                  vpcmpeqd_avx2(ZEXT1632(local_530),ZEXT1632(local_530));
                  uStack_2bc = (local_590.context)->instID[0];
                  local_2c0 = uStack_2bc;
                  uStack_2b8 = uStack_2bc;
                  uStack_2b4 = uStack_2bc;
                  uStack_2b0 = (local_590.context)->instPrimID[0];
                  uStack_2ac = uStack_2b0;
                  uStack_2a8 = uStack_2b0;
                  uStack_2a4 = uStack_2b0;
                  local_5e0 = local_390;
                  local_590.valid = (int *)local_5e0;
                  local_590.geometryUserPtr = local_5a0->userPtr;
                  local_590.hit = local_330;
                  local_590.N = 4;
                  local_5b0._0_8_ = uVar69;
                  local_598 = uVar74;
                  local_590.ray = (RTCRayN *)ray;
                  uStack_2ec = local_2f0;
                  uStack_2e8 = local_2f0;
                  uStack_2e4 = local_2f0;
                  if (local_5a0->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*local_5a0->occlusionFilterN)(&local_590);
                    auVar173 = ZEXT1664(local_5c0);
                    uVar69 = local_5b0._0_8_;
                  }
                  uVar74 = vptestmd_avx512vl(local_5e0,local_5e0);
                  if ((uVar74 & 0xf) != 0) {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((local_5a0->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&local_590);
                      auVar173 = ZEXT1664(local_5c0);
                      uVar69 = local_5b0._0_8_;
                    }
                    auVar78 = auVar179._0_16_;
                    auVar80 = *(undefined1 (*) [16])(local_590.ray + 0x80);
                    uVar74 = vptestmd_avx512vl(local_5e0,local_5e0);
                    uVar74 = uVar74 & 0xf;
                    auVar77 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar12 = (bool)((byte)uVar74 & 1);
                    auVar84._0_4_ = (uint)bVar12 * auVar77._0_4_ | (uint)!bVar12 * auVar80._0_4_;
                    bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                    auVar84._4_4_ = (uint)bVar12 * auVar77._4_4_ | (uint)!bVar12 * auVar80._4_4_;
                    bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
                    auVar84._8_4_ = (uint)bVar12 * auVar77._8_4_ | (uint)!bVar12 * auVar80._8_4_;
                    bVar12 = SUB81(uVar74 >> 3,0);
                    auVar84._12_4_ = (uint)bVar12 * auVar77._12_4_ | (uint)!bVar12 * auVar80._12_4_;
                    *(undefined1 (*) [16])(local_590.ray + 0x80) = auVar84;
                    if ((byte)uVar74 != 0) {
                      bVar67 = 1;
                      goto LAB_019eb977;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar133;
                  uVar74 = 0;
                  uVar69 = uVar69 ^ 1L << (local_598 & 0x3f);
                  for (uVar20 = uVar69; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000
                      ) {
                    uVar74 = uVar74 + 1;
                  }
                }
                bVar67 = 0;
LAB_019eb977:
                auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar186 = ZEXT3264(auVar93);
                auVar78 = vxorps_avx512vl(auVar78,auVar78);
                auVar179 = ZEXT1664(auVar78);
                auVar180 = ZEXT3264(local_3e0);
                auVar181 = ZEXT3264(local_400);
                auVar182 = ZEXT3264(local_420);
                auVar178 = ZEXT3264(local_440);
                auVar177 = ZEXT3264(local_560);
                auVar183 = ZEXT3264(local_500);
                auVar184 = ZEXT3264(local_4c0);
                auVar185 = ZEXT3264(local_4e0);
              }
              bVar66 = (bool)(bVar66 | bVar67);
            }
          }
        }
      }
    }
    if (bVar66) break;
    uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar26._4_4_ = uVar133;
    auVar26._0_4_ = uVar133;
    auVar26._8_4_ = uVar133;
    auVar26._12_4_ = uVar133;
    auVar26._16_4_ = uVar133;
    auVar26._20_4_ = uVar133;
    auVar26._24_4_ = uVar133;
    auVar26._28_4_ = uVar133;
    uVar142 = vcmpps_avx512vl(local_80,auVar26,2);
    local_468 = (ulong)((uint)uVar70 & (uint)uVar142);
  }
  return local_468 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }